

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  uint uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  byte bVar70;
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  long lVar76;
  ulong uVar77;
  uint uVar78;
  ulong uVar79;
  byte bVar80;
  float fVar81;
  float fVar82;
  float fVar129;
  float fVar131;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar90 [16];
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined4 uVar138;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined8 uVar150;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar175;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar176;
  float fVar183;
  float fVar184;
  vint4 ai_2;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar185;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_624;
  Precalculations *local_620;
  RayQueryContext *local_618;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [32];
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined4 local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  uint local_514;
  uint local_510;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  Geometry *local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  undefined4 uStack_40c;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  int local_2fc;
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  byte local_2b0;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar196 [64];
  
  PVar9 = prim[1];
  uVar77 = (ulong)(byte)PVar9;
  fVar160 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar87 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar161._0_4_ = fVar160 * auVar87._0_4_;
  auVar161._4_4_ = fVar160 * auVar87._4_4_;
  auVar161._8_4_ = fVar160 * auVar87._8_4_;
  auVar161._12_4_ = fVar160 * auVar87._12_4_;
  auVar90._0_4_ = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar90._4_4_ = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar90._8_4_ = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar90._12_4_ = fVar160 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar77 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar79 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar77 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar72 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar206._4_4_ = auVar90._0_4_;
  auVar206._0_4_ = auVar90._0_4_;
  auVar206._8_4_ = auVar90._0_4_;
  auVar206._12_4_ = auVar90._0_4_;
  auVar23 = vshufps_avx(auVar90,auVar90,0x55);
  auVar86 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar160 = auVar86._0_4_;
  auVar153._0_4_ = fVar160 * auVar142._0_4_;
  fVar176 = auVar86._4_4_;
  auVar153._4_4_ = fVar176 * auVar142._4_4_;
  fVar183 = auVar86._8_4_;
  auVar153._8_4_ = fVar183 * auVar142._8_4_;
  fVar184 = auVar86._12_4_;
  auVar153._12_4_ = fVar184 * auVar142._12_4_;
  auVar151._0_4_ = auVar20._0_4_ * fVar160;
  auVar151._4_4_ = auVar20._4_4_ * fVar176;
  auVar151._8_4_ = auVar20._8_4_ * fVar183;
  auVar151._12_4_ = auVar20._12_4_ * fVar184;
  auVar139._0_4_ = auVar89._0_4_ * fVar160;
  auVar139._4_4_ = auVar89._4_4_ * fVar176;
  auVar139._8_4_ = auVar89._8_4_ * fVar183;
  auVar139._12_4_ = auVar89._12_4_ * fVar184;
  auVar86 = vfmadd231ps_fma(auVar153,auVar23,auVar85);
  auVar84 = vfmadd231ps_fma(auVar151,auVar23,auVar88);
  auVar23 = vfmadd231ps_fma(auVar139,auVar22,auVar23);
  auVar83 = vfmadd231ps_fma(auVar86,auVar206,auVar87);
  auVar84 = vfmadd231ps_fma(auVar84,auVar206,auVar141);
  auVar90 = vfmadd231ps_fma(auVar23,auVar21,auVar206);
  auVar207._4_4_ = auVar161._0_4_;
  auVar207._0_4_ = auVar161._0_4_;
  auVar207._8_4_ = auVar161._0_4_;
  auVar207._12_4_ = auVar161._0_4_;
  auVar23 = vshufps_avx(auVar161,auVar161,0x55);
  auVar86 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar160 = auVar86._0_4_;
  auVar208._0_4_ = fVar160 * auVar142._0_4_;
  fVar176 = auVar86._4_4_;
  auVar208._4_4_ = fVar176 * auVar142._4_4_;
  fVar183 = auVar86._8_4_;
  auVar208._8_4_ = fVar183 * auVar142._8_4_;
  fVar184 = auVar86._12_4_;
  auVar208._12_4_ = fVar184 * auVar142._12_4_;
  auVar177._0_4_ = auVar20._0_4_ * fVar160;
  auVar177._4_4_ = auVar20._4_4_ * fVar176;
  auVar177._8_4_ = auVar20._8_4_ * fVar183;
  auVar177._12_4_ = auVar20._12_4_ * fVar184;
  auVar162._0_4_ = auVar89._0_4_ * fVar160;
  auVar162._4_4_ = auVar89._4_4_ * fVar176;
  auVar162._8_4_ = auVar89._8_4_ * fVar183;
  auVar162._12_4_ = auVar89._12_4_ * fVar184;
  auVar85 = vfmadd231ps_fma(auVar208,auVar23,auVar85);
  auVar142 = vfmadd231ps_fma(auVar177,auVar23,auVar88);
  auVar88 = vfmadd231ps_fma(auVar162,auVar23,auVar22);
  auVar20 = vfmadd231ps_fma(auVar85,auVar207,auVar87);
  auVar22 = vfmadd231ps_fma(auVar142,auVar207,auVar141);
  auVar197._8_4_ = 0x7fffffff;
  auVar197._0_8_ = 0x7fffffff7fffffff;
  auVar197._12_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(auVar88,auVar207,auVar21);
  auVar87 = vandps_avx(auVar83,auVar197);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar87,auVar193,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar86._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar83._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar83._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar83._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar83._12_4_;
  auVar87 = vandps_avx(auVar84,auVar197);
  uVar79 = vcmpps_avx512vl(auVar87,auVar193,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar83._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar84._12_4_;
  auVar87 = vandps_avx(auVar90,auVar197);
  uVar79 = vcmpps_avx512vl(auVar87,auVar193,1);
  bVar13 = (bool)((byte)uVar79 & 1);
  auVar84._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._0_4_;
  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._4_4_;
  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._8_4_;
  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar86);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = &DAT_3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar86,auVar85,auVar194);
  auVar141 = vfmadd132ps_fma(auVar87,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar87 = vfnmadd213ps_fma(auVar83,auVar85,auVar194);
  auVar88 = vfmadd132ps_fma(auVar87,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar87 = vfnmadd213ps_fma(auVar84,auVar85,auVar194);
  auVar21 = vfmadd132ps_fma(auVar87,auVar85,auVar85);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar20);
  auVar186._0_4_ = auVar141._0_4_ * auVar87._0_4_;
  auVar186._4_4_ = auVar141._4_4_ * auVar87._4_4_;
  auVar186._8_4_ = auVar141._8_4_ * auVar87._8_4_;
  auVar186._12_4_ = auVar141._12_4_ * auVar87._12_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar85);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar20);
  auVar86 = vpbroadcastd_avx512vl();
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar85 = vpmovsxwd_avx(auVar142);
  auVar154._0_4_ = auVar141._0_4_ * auVar87._0_4_;
  auVar154._4_4_ = auVar141._4_4_ * auVar87._4_4_;
  auVar154._8_4_ = auVar141._8_4_ * auVar87._8_4_;
  auVar154._12_4_ = auVar141._12_4_ * auVar87._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar77 * -2 + 6);
  auVar87 = vpmovsxwd_avx(auVar141);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar22);
  auVar195._0_4_ = auVar88._0_4_ * auVar87._0_4_;
  auVar195._4_4_ = auVar88._4_4_ * auVar87._4_4_;
  auVar195._8_4_ = auVar88._8_4_ * auVar87._8_4_;
  auVar195._12_4_ = auVar88._12_4_ * auVar87._12_4_;
  auVar196 = ZEXT1664(auVar195);
  auVar87 = vcvtdq2ps_avx(auVar85);
  auVar87 = vsubps_avx(auVar87,auVar22);
  auVar152._0_4_ = auVar88._0_4_ * auVar87._0_4_;
  auVar152._4_4_ = auVar88._4_4_ * auVar87._4_4_;
  auVar152._8_4_ = auVar88._8_4_ * auVar87._8_4_;
  auVar152._12_4_ = auVar88._12_4_ * auVar87._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 + uVar77 + 6);
  auVar87 = vpmovsxwd_avx(auVar88);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar89);
  auVar178._0_4_ = auVar21._0_4_ * auVar87._0_4_;
  auVar178._4_4_ = auVar21._4_4_ * auVar87._4_4_;
  auVar178._8_4_ = auVar21._8_4_ * auVar87._8_4_;
  auVar178._12_4_ = auVar21._12_4_ * auVar87._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar87 = vpmovsxwd_avx(auVar20);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar89);
  auVar140._0_4_ = auVar21._0_4_ * auVar87._0_4_;
  auVar140._4_4_ = auVar21._4_4_ * auVar87._4_4_;
  auVar140._8_4_ = auVar21._8_4_ * auVar87._8_4_;
  auVar140._12_4_ = auVar21._12_4_ * auVar87._12_4_;
  auVar87 = vpminsd_avx(auVar186,auVar154);
  auVar85 = vpminsd_avx(auVar195,auVar152);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar85 = vpminsd_avx(auVar178,auVar140);
  uVar138 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar21._4_4_ = uVar138;
  auVar21._0_4_ = uVar138;
  auVar21._8_4_ = uVar138;
  auVar21._12_4_ = uVar138;
  auVar85 = vmaxps_avx512vl(auVar85,auVar21);
  auVar87 = vmaxps_avx(auVar87,auVar85);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_1d0 = vmulps_avx512vl(auVar87,auVar22);
  auVar174 = ZEXT1664(local_1d0);
  auVar87 = vpmaxsd_avx(auVar186,auVar154);
  auVar85 = vpmaxsd_avx(auVar195,auVar152);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar85 = vpmaxsd_avx(auVar178,auVar140);
  fVar160 = (ray->super_RayK<1>).tfar;
  auVar89._4_4_ = fVar160;
  auVar89._0_4_ = fVar160;
  auVar89._8_4_ = fVar160;
  auVar89._12_4_ = fVar160;
  auVar85 = vminps_avx512vl(auVar85,auVar89);
  auVar87 = vminps_avx(auVar87,auVar85);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar23);
  uVar150 = vcmpps_avx512vl(local_1d0,auVar87,2);
  uVar79 = vpcmpgtd_avx512vl(auVar86,_DAT_01ff0cf0);
  uVar79 = ((byte)uVar150 & 0xf) & uVar79;
  if ((char)uVar79 != '\0') {
    do {
      local_580 = auVar196._0_32_;
      local_5e0 = auVar174._0_32_;
      local_460 = in_ZMM21._0_32_;
      local_440 = in_ZMM20._0_32_;
      lVar26 = 0;
      for (uVar72 = uVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar78 = *(uint *)(prim + 2);
      uVar75 = *(uint *)(prim + lVar26 * 4 + 6);
      local_608 = (ulong)uVar78;
      pGVar11 = (context->scene->geometries).items[uVar78].ptr;
      local_5e8 = (ulong)uVar75;
      uVar72 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar75);
      p_Var12 = pGVar11[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar11[1].time_range.upper;
      local_600 = *(undefined1 (*) [16])(lVar26 + (long)p_Var12 * uVar72);
      pauVar3 = (undefined1 (*) [16])(lVar26 + (uVar72 + 1) * (long)p_Var12);
      local_550 = *(undefined8 *)*pauVar3;
      uStack_548 = *(undefined8 *)(*pauVar3 + 8);
      auVar87 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar26 + (uVar72 + 2) * (long)p_Var12);
      local_560 = *(undefined8 *)*pauVar4;
      uStack_558 = *(undefined8 *)(*pauVar4 + 8);
      auVar85 = *pauVar4;
      uVar79 = uVar79 - 1 & uVar79;
      pauVar5 = (undefined1 (*) [12])(lVar26 + (uVar72 + 3) * (long)p_Var12);
      local_2c0 = *(undefined8 *)*pauVar5;
      uStack_2b8 = *(undefined8 *)(*pauVar5 + 8);
      local_540 = (float)local_2c0;
      fStack_53c = (float)((ulong)local_2c0 >> 0x20);
      fStack_538 = (float)uStack_2b8;
      fStack_534 = (float)((ulong)uStack_2b8 >> 0x20);
      if (uVar79 != 0) {
        uVar77 = uVar79 - 1 & uVar79;
        for (uVar72 = uVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        }
        if (uVar77 != 0) {
          for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->super_RayK<1>).org.field_0;
      auVar141 = vsubps_avx(local_600,(undefined1  [16])aVar6);
      uVar138 = auVar141._0_4_;
      auVar155._4_4_ = uVar138;
      auVar155._0_4_ = uVar138;
      auVar155._8_4_ = uVar138;
      auVar155._12_4_ = uVar138;
      auVar142 = vshufps_avx(auVar141,auVar141,0x55);
      auVar141 = vshufps_avx(auVar141,auVar141,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar160 = (pre->ray_space).vz.field_0.m128[0];
      fVar176 = (pre->ray_space).vz.field_0.m128[1];
      fVar183 = (pre->ray_space).vz.field_0.m128[2];
      fVar184 = (pre->ray_space).vz.field_0.m128[3];
      auVar200._0_4_ = auVar141._0_4_ * fVar160;
      auVar200._4_4_ = auVar141._4_4_ * fVar176;
      auVar200._8_4_ = auVar141._8_4_ * fVar183;
      auVar200._12_4_ = auVar141._12_4_ * fVar184;
      auVar142 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar8,auVar142);
      auVar20 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar7,auVar155);
      auVar142 = vshufps_avx(local_600,local_600,0xff);
      auVar88 = vsubps_avx(auVar87,(undefined1  [16])aVar6);
      uVar138 = auVar88._0_4_;
      auVar163._4_4_ = uVar138;
      auVar163._0_4_ = uVar138;
      auVar163._8_4_ = uVar138;
      auVar163._12_4_ = uVar138;
      auVar141 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar201._0_4_ = auVar88._0_4_ * fVar160;
      auVar201._4_4_ = auVar88._4_4_ * fVar176;
      auVar201._8_4_ = auVar88._8_4_ * fVar183;
      auVar201._12_4_ = auVar88._12_4_ * fVar184;
      auVar141 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar8,auVar141);
      auVar21 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar7,auVar163);
      auVar87 = vshufps_avx(auVar87,auVar87,0xff);
      auVar88 = vsubps_avx(auVar85,(undefined1  [16])aVar6);
      uVar138 = auVar88._0_4_;
      auVar198._4_4_ = uVar138;
      auVar198._0_4_ = uVar138;
      auVar198._8_4_ = uVar138;
      auVar198._12_4_ = uVar138;
      auVar141 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar204._0_4_ = auVar88._0_4_ * fVar160;
      auVar204._4_4_ = auVar88._4_4_ * fVar176;
      auVar204._8_4_ = auVar88._8_4_ * fVar183;
      auVar204._12_4_ = auVar88._12_4_ * fVar184;
      auVar141 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar8,auVar141);
      auVar22 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar7,auVar198);
      auVar85 = vshufps_avx(auVar85,auVar85,0xff);
      auVar64._12_4_ = fStack_534;
      auVar64._0_12_ = *pauVar5;
      auVar88 = vsubps_avx512vl(auVar64,(undefined1  [16])aVar6);
      uVar138 = auVar88._0_4_;
      auVar164._4_4_ = uVar138;
      auVar164._0_4_ = uVar138;
      auVar164._8_4_ = uVar138;
      auVar164._12_4_ = uVar138;
      auVar141 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar205._0_4_ = auVar88._0_4_ * fVar160;
      auVar205._4_4_ = auVar88._4_4_ * fVar176;
      auVar205._8_4_ = auVar88._8_4_ * fVar183;
      auVar205._12_4_ = auVar88._12_4_ * fVar184;
      auVar141 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar8,auVar141);
      auVar141 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar7,auVar164);
      lVar26 = (long)iVar10 * 0x44;
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      auVar88 = vshufps_avx512vl(auVar64,auVar64,0xff);
      local_3c0 = vbroadcastss_avx512vl(auVar20);
      auVar91._8_4_ = 1;
      auVar91._0_8_ = 0x100000001;
      auVar91._12_4_ = 1;
      auVar91._16_4_ = 1;
      auVar91._20_4_ = 1;
      auVar91._24_4_ = 1;
      auVar91._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar20));
      uVar150 = auVar142._0_8_;
      local_80._8_8_ = uVar150;
      local_80._0_8_ = uVar150;
      local_80._16_8_ = uVar150;
      local_80._24_8_ = uVar150;
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      uVar138 = auVar21._0_4_;
      local_500._4_4_ = uVar138;
      local_500._0_4_ = uVar138;
      local_500._8_4_ = uVar138;
      local_500._12_4_ = uVar138;
      local_500._16_4_ = uVar138;
      local_500._20_4_ = uVar138;
      local_500._24_4_ = uVar138;
      local_500._28_4_ = uVar138;
      local_1c0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar21));
      uVar150 = auVar87._0_8_;
      local_a0._8_8_ = uVar150;
      local_a0._0_8_ = uVar150;
      local_a0._16_8_ = uVar150;
      local_a0._24_8_ = uVar150;
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar22);
      local_e0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar22));
      local_100 = vbroadcastsd_avx512vl(auVar85);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_480 = vbroadcastss_avx512vl(auVar141);
      auVar216 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar141));
      auVar217 = ZEXT3264(local_4a0);
      _local_120 = vbroadcastsd_avx512vl(auVar88);
      auVar91 = vmulps_avx512vl(local_480,auVar105);
      auVar92 = vmulps_avx512vl(local_4a0,auVar105);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar106,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar106,local_e0);
      auVar87 = vfmadd231ps_fma(auVar91,auVar108,local_500);
      auVar93 = vfmadd231ps_avx512vl(auVar92,auVar108,local_1c0);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar107,local_3c0);
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar107,local_4e0);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar96 = vmulps_avx512vl(local_480,auVar104);
      auVar97 = vmulps_avx512vl(local_4a0,auVar104);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_e0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_500);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_1c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_3c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,local_4e0);
      auVar98 = vsubps_avx512vl(auVar96,auVar94);
      auVar99 = vsubps_avx512vl(auVar97,auVar95);
      auVar100 = vmulps_avx512vl(auVar95,auVar98);
      auVar101 = vmulps_avx512vl(auVar94,auVar99);
      auVar100 = vsubps_avx512vl(auVar100,auVar101);
      auVar101 = vmulps_avx512vl(_local_120,auVar105);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_100);
      auVar87 = vfmadd231ps_fma(auVar101,auVar108,local_a0);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar107,local_80);
      auVar102 = vmulps_avx512vl(_local_120,auVar104);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_100);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_a0);
      auVar142 = vfmadd231ps_fma(auVar102,auVar91,local_80);
      auVar102 = vmulps_avx512vl(auVar99,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
      auVar103 = vmaxps_avx512vl(auVar101,ZEXT1632(auVar142));
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      auVar102 = vmulps_avx512vl(auVar103,auVar102);
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      uVar150 = vcmpps_avx512vl(auVar100,auVar102,2);
      auVar87 = vblendps_avx(auVar20,local_600,8);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar85 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vblendps_avx(auVar21,*pauVar3,8);
      auVar87 = vandps_avx512vl(auVar87,auVar88);
      auVar85 = vmaxps_avx(auVar85,auVar87);
      auVar87 = vblendps_avx(auVar22,*pauVar4,8);
      auVar89 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vblendps_avx(auVar141,auVar64,8);
      auVar87 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vmaxps_avx(auVar89,auVar87);
      auVar87 = vmaxps_avx(auVar85,auVar87);
      auVar85 = vmovshdup_avx(auVar87);
      auVar85 = vmaxss_avx(auVar85,auVar87);
      auVar87 = vshufpd_avx(auVar87,auVar87,1);
      auVar87 = vmaxss_avx(auVar87,auVar85);
      local_380._0_4_ = (undefined4)iVar10;
      register0x00001504 = auVar20._4_12_;
      auVar102._4_4_ = local_380._0_4_;
      auVar102._0_4_ = local_380._0_4_;
      auVar102._8_4_ = local_380._0_4_;
      auVar102._12_4_ = local_380._0_4_;
      auVar102._16_4_ = local_380._0_4_;
      auVar102._20_4_ = local_380._0_4_;
      auVar102._24_4_ = local_380._0_4_;
      auVar102._28_4_ = local_380._0_4_;
      uVar24 = vcmpps_avx512vl(auVar102,_DAT_02020f40,0xe);
      bVar80 = (byte)uVar150 & (byte)uVar24;
      auVar87 = vmulss_avx512f(auVar87,ZEXT416(0x35000000));
      auVar100._8_4_ = 2;
      auVar100._0_8_ = 0x200000002;
      auVar100._12_4_ = 2;
      auVar100._16_4_ = 2;
      auVar100._20_4_ = 2;
      auVar100._24_4_ = 2;
      auVar100._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar100,ZEXT1632(auVar20));
      local_160 = vpermps_avx512vl(auVar100,ZEXT1632(auVar21));
      local_180 = vpermps_avx512vl(auVar100,ZEXT1632(auVar22));
      local_1a0 = vpermps_avx2(auVar100,ZEXT1632(auVar141));
      uVar74 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar85 = auVar99._0_16_;
      if (bVar80 == 0) {
        auVar85 = vxorps_avx512vl(auVar85,auVar85);
        auVar214 = ZEXT1664(auVar85);
        auVar196 = ZEXT3264(local_580);
        in_ZMM20 = ZEXT3264(local_440);
        auVar174 = ZEXT3264(local_5e0);
        in_ZMM21 = ZEXT3264(local_460);
        auVar213 = ZEXT3264(local_3c0);
        auVar211 = ZEXT3264(local_4e0);
        auVar212 = ZEXT3264(local_500);
      }
      else {
        local_400._0_16_ = ZEXT416(uVar74);
        local_3e0._0_16_ = auVar87;
        auVar104 = vmulps_avx512vl(local_1a0,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_180,auVar104);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
        auVar104 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
        auVar105 = vmulps_avx512vl(local_1a0,auVar105);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar105);
        auVar92 = vfmadd213ps_avx512vl(auVar108,local_160,auVar106);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1f9c);
        auVar100 = vfmadd213ps_avx512vl(auVar107,local_140,auVar92);
        auVar107 = vmulps_avx512vl(local_480,auVar91);
        auVar92 = vmulps_avx512vl(local_4a0,auVar91);
        auVar91 = vmulps_avx512vl(local_1a0,auVar91);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_e0);
        auVar105 = vfmadd231ps_avx512vl(auVar91,local_180,auVar105);
        auVar212 = ZEXT3264(local_500);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_500);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar106,local_1c0);
        auVar92 = vfmadd231ps_avx512vl(auVar105,local_160,auVar106);
        auVar93 = vfmadd231ps_avx512vl(auVar107,auVar108,local_3c0);
        auVar211 = ZEXT3264(local_4e0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_4e0);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_140,auVar108);
        auVar108 = vmulps_avx512vl(local_480,auVar105);
        auVar102 = vmulps_avx512vl(local_4a0,auVar105);
        auVar105 = vmulps_avx512vl(local_1a0,auVar105);
        auVar215 = ZEXT1664(auVar87);
        auVar103 = vfmadd231ps_avx512vl(auVar108,auVar106,local_c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_e0);
        auVar106 = vfmadd231ps_avx512vl(auVar105,local_180,auVar106);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar108,local_500);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_1c0);
        auVar108 = vfmadd231ps_avx512vl(auVar106,local_160,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar105,auVar107,local_3c0);
        auVar105 = vfmadd231ps_avx512vl(auVar102,auVar107,local_4e0);
        auVar102 = vfmadd231ps_avx512vl(auVar108,local_140,auVar107);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar93,auVar209);
        auVar108 = vandps_avx(auVar91,auVar209);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar92,auVar209);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        auVar92 = vbroadcastss_avx512vl(auVar87);
        uVar72 = vcmpps_avx512vl(auVar107,auVar92,1);
        bVar13 = (bool)((byte)uVar72 & 1);
        auVar103._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar93._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar93._16_4_);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar93._20_4_);
        bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar93._24_4_);
        bVar13 = SUB81(uVar72 >> 7,0);
        auVar103._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar93._28_4_;
        bVar13 = (bool)((byte)uVar72 & 1);
        auVar109._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar91._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar91._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar91._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar91._12_4_);
        bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar91._16_4_);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar91._20_4_);
        bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar91._24_4_);
        bVar13 = SUB81(uVar72 >> 7,0);
        auVar109._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar91._28_4_;
        auVar107 = vandps_avx(auVar209,auVar106);
        auVar108 = vandps_avx(auVar105,auVar209);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar102,auVar209);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        uVar72 = vcmpps_avx512vl(auVar107,auVar92,1);
        bVar13 = (bool)((byte)uVar72 & 1);
        auVar110._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar72 >> 7,0);
        auVar110._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        bVar13 = (bool)((byte)uVar72 & 1);
        auVar98._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar105._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar105._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar105._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar105._12_4_);
        bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar105._16_4_);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar105._20_4_);
        bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar105._24_4_);
        bVar13 = SUB81(uVar72 >> 7,0);
        auVar98._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar105._28_4_;
        auVar90 = vxorps_avx512vl(auVar85,auVar85);
        auVar214 = ZEXT1664(auVar90);
        auVar107 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar90));
        auVar85 = vfmadd231ps_fma(auVar107,auVar109,auVar109);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        fVar160 = auVar106._0_4_;
        fVar176 = auVar106._4_4_;
        fVar183 = auVar106._8_4_;
        fVar184 = auVar106._12_4_;
        fVar185 = auVar106._16_4_;
        fVar175 = auVar106._20_4_;
        fVar81 = auVar106._24_4_;
        auVar107._4_4_ = fVar176 * fVar176 * fVar176 * auVar85._4_4_ * -0.5;
        auVar107._0_4_ = fVar160 * fVar160 * fVar160 * auVar85._0_4_ * -0.5;
        auVar107._8_4_ = fVar183 * fVar183 * fVar183 * auVar85._8_4_ * -0.5;
        auVar107._12_4_ = fVar184 * fVar184 * fVar184 * auVar85._12_4_ * -0.5;
        auVar107._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar107._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar107._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar107._28_4_ = 0;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar91,auVar106);
        auVar108._4_4_ = auVar109._4_4_ * auVar107._4_4_;
        auVar108._0_4_ = auVar109._0_4_ * auVar107._0_4_;
        auVar108._8_4_ = auVar109._8_4_ * auVar107._8_4_;
        auVar108._12_4_ = auVar109._12_4_ * auVar107._12_4_;
        auVar108._16_4_ = auVar109._16_4_ * auVar107._16_4_;
        auVar108._20_4_ = auVar109._20_4_ * auVar107._20_4_;
        auVar108._24_4_ = auVar109._24_4_ * auVar107._24_4_;
        auVar108._28_4_ = auVar106._28_4_;
        auVar106._4_4_ = auVar107._4_4_ * -auVar103._4_4_;
        auVar106._0_4_ = auVar107._0_4_ * -auVar103._0_4_;
        auVar106._8_4_ = auVar107._8_4_ * -auVar103._8_4_;
        auVar106._12_4_ = auVar107._12_4_ * -auVar103._12_4_;
        auVar106._16_4_ = auVar107._16_4_ * -auVar103._16_4_;
        auVar106._20_4_ = auVar107._20_4_ * -auVar103._20_4_;
        auVar106._24_4_ = auVar107._24_4_ * -auVar103._24_4_;
        auVar106._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar107,ZEXT1632(auVar90));
        auVar102 = ZEXT1632(auVar90);
        auVar105 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar102);
        auVar85 = vfmadd231ps_fma(auVar105,auVar98,auVar98);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
        fVar160 = auVar93._0_4_;
        fVar176 = auVar93._4_4_;
        fVar183 = auVar93._8_4_;
        fVar184 = auVar93._12_4_;
        fVar185 = auVar93._16_4_;
        fVar175 = auVar93._20_4_;
        fVar81 = auVar93._24_4_;
        auVar105._4_4_ = fVar176 * fVar176 * fVar176 * auVar85._4_4_ * -0.5;
        auVar105._0_4_ = fVar160 * fVar160 * fVar160 * auVar85._0_4_ * -0.5;
        auVar105._8_4_ = fVar183 * fVar183 * fVar183 * auVar85._8_4_ * -0.5;
        auVar105._12_4_ = fVar184 * fVar184 * fVar184 * auVar85._12_4_ * -0.5;
        auVar105._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar105._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar105._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar105._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar91,auVar93);
        auVar92._4_4_ = auVar98._4_4_ * auVar105._4_4_;
        auVar92._0_4_ = auVar98._0_4_ * auVar105._0_4_;
        auVar92._8_4_ = auVar98._8_4_ * auVar105._8_4_;
        auVar92._12_4_ = auVar98._12_4_ * auVar105._12_4_;
        auVar92._16_4_ = auVar98._16_4_ * auVar105._16_4_;
        auVar92._20_4_ = auVar98._20_4_ * auVar105._20_4_;
        auVar92._24_4_ = auVar98._24_4_ * auVar105._24_4_;
        auVar92._28_4_ = auVar93._28_4_;
        auVar93._4_4_ = -auVar110._4_4_ * auVar105._4_4_;
        auVar93._0_4_ = -auVar110._0_4_ * auVar105._0_4_;
        auVar93._8_4_ = -auVar110._8_4_ * auVar105._8_4_;
        auVar93._12_4_ = -auVar110._12_4_ * auVar105._12_4_;
        auVar93._16_4_ = -auVar110._16_4_ * auVar105._16_4_;
        auVar93._20_4_ = -auVar110._20_4_ * auVar105._20_4_;
        auVar93._24_4_ = -auVar110._24_4_ * auVar105._24_4_;
        auVar93._28_4_ = auVar107._28_4_;
        auVar107 = vmulps_avx512vl(auVar105,auVar102);
        auVar85 = vfmadd213ps_fma(auVar108,auVar101,auVar94);
        auVar141 = vfmadd213ps_fma(auVar106,auVar101,auVar95);
        auVar105 = vfmadd213ps_avx512vl(auVar99,auVar101,auVar100);
        auVar91 = vfmadd213ps_avx512vl(auVar92,ZEXT1632(auVar142),auVar96);
        auVar89 = vfnmadd213ps_fma(auVar108,auVar101,auVar94);
        auVar94 = ZEXT1632(auVar142);
        auVar88 = vfmadd213ps_fma(auVar93,auVar94,auVar97);
        auVar23 = vfnmadd213ps_fma(auVar106,auVar101,auVar95);
        auVar20 = vfmadd213ps_fma(auVar107,auVar94,auVar104);
        auVar108 = vfnmadd231ps_avx512vl(auVar100,auVar101,auVar99);
        auVar86 = vfnmadd213ps_fma(auVar92,auVar94,auVar96);
        auVar84 = vfnmadd213ps_fma(auVar93,auVar94,auVar97);
        auVar83 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar142),auVar107);
        auVar106 = vsubps_avx512vl(auVar91,ZEXT1632(auVar89));
        auVar107 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar23));
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar20),auVar108);
        auVar93 = vmulps_avx512vl(auVar107,auVar108);
        auVar21 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar23),auVar92);
        auVar104._4_4_ = auVar89._4_4_ * auVar92._4_4_;
        auVar104._0_4_ = auVar89._0_4_ * auVar92._0_4_;
        auVar104._8_4_ = auVar89._8_4_ * auVar92._8_4_;
        auVar104._12_4_ = auVar89._12_4_ * auVar92._12_4_;
        auVar104._16_4_ = auVar92._16_4_ * 0.0;
        auVar104._20_4_ = auVar92._20_4_ * 0.0;
        auVar104._24_4_ = auVar92._24_4_ * 0.0;
        auVar104._28_4_ = auVar92._28_4_;
        auVar92 = vfmsub231ps_avx512vl(auVar104,auVar108,auVar106);
        auVar94._4_4_ = auVar23._4_4_ * auVar106._4_4_;
        auVar94._0_4_ = auVar23._0_4_ * auVar106._0_4_;
        auVar94._8_4_ = auVar23._8_4_ * auVar106._8_4_;
        auVar94._12_4_ = auVar23._12_4_ * auVar106._12_4_;
        auVar94._16_4_ = auVar106._16_4_ * 0.0;
        auVar94._20_4_ = auVar106._20_4_ * 0.0;
        auVar94._24_4_ = auVar106._24_4_ * 0.0;
        auVar94._28_4_ = auVar106._28_4_;
        auVar22 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar89),auVar107);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar102,auVar92);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,ZEXT1632(auVar21));
        auVar98 = ZEXT1632(auVar90);
        uVar72 = vcmpps_avx512vl(auVar107,auVar98,2);
        bVar71 = (byte)uVar72;
        fVar81 = (float)((uint)(bVar71 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar86._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar129 = (float)((uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar86._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar131 = (float)((uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar86._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar134 = (float)((uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar86._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar129,fVar81))));
        fVar82 = (float)((uint)(bVar71 & 1) * auVar141._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar84._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar130 = (float)((uint)bVar13 * auVar141._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar132 = (float)((uint)bVar13 * auVar141._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar135 = (float)((uint)bVar13 * auVar141._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar82))));
        auVar99._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar83._0_4_
                    );
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar83._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar83._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar83._12_4_);
        fVar160 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar105._16_4_);
        auVar99._16_4_ = fVar160;
        fVar176 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar105._20_4_);
        auVar99._20_4_ = fVar176;
        fVar183 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar105._24_4_);
        auVar99._24_4_ = fVar183;
        iVar1 = (uint)(byte)(uVar72 >> 7) * auVar105._28_4_;
        auVar99._28_4_ = iVar1;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar91);
        auVar111._0_4_ =
             (uint)(bVar71 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar21._0_4_;
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar21._4_4_;
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar21._8_4_;
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar21._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar106._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar106._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar106._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar23),ZEXT1632(auVar88));
        auVar112._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar106._0_4_ |
                    (uint)!(bool)(bVar71 & 1) * auVar141._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar141._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar141._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar141._12_4_);
        fVar184 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar106._16_4_);
        auVar112._16_4_ = fVar184;
        fVar185 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar106._20_4_);
        auVar112._20_4_ = fVar185;
        fVar175 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar106._24_4_);
        auVar112._24_4_ = fVar175;
        auVar112._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(auVar108,ZEXT1632(auVar20));
        auVar113._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar106._0_4_ |
                    (uint)!(bool)(bVar71 & 1) * auVar105._0_4_);
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar105._4_4_);
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar105._8_4_);
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar105._12_4_);
        bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * auVar105._16_4_);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * auVar105._20_4_);
        bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * auVar105._24_4_);
        bVar13 = SUB81(uVar72 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * auVar105._28_4_;
        auVar114._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar91._0_4_;
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar13 * (int)auVar89._4_4_ | (uint)!bVar13 * auVar91._4_4_;
        bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar13 * (int)auVar89._8_4_ | (uint)!bVar13 * auVar91._8_4_;
        bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar13 * (int)auVar89._12_4_ | (uint)!bVar13 * auVar91._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar91._28_4_;
        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar115._0_4_ =
             (uint)(bVar71 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar20._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar20._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar20._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar20._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar108._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar108._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar108._24_4_;
        iVar2 = (uint)(byte)(uVar72 >> 7) * auVar108._28_4_;
        auVar115._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar114,auVar93);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar23._12_4_ |
                                                 (uint)!bVar16 * auVar88._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar23._8_4_ |
                                                          (uint)!bVar15 * auVar88._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar23._4_4_
                                                                   | (uint)!bVar13 * auVar88._4_4_,
                                                                   (uint)(bVar71 & 1) *
                                                                   (int)auVar23._0_4_ |
                                                                   (uint)!(bool)(bVar71 & 1) *
                                                                   auVar88._0_4_)))),auVar104);
        auVar106 = vsubps_avx(auVar115,auVar99);
        auVar105 = vsubps_avx(auVar93,auVar111);
        auVar91 = vsubps_avx(auVar104,auVar112);
        auVar92 = vsubps_avx(auVar99,auVar113);
        auVar95._4_4_ = auVar106._4_4_ * fVar129;
        auVar95._0_4_ = auVar106._0_4_ * fVar81;
        auVar95._8_4_ = auVar106._8_4_ * fVar131;
        auVar95._12_4_ = auVar106._12_4_ * fVar134;
        auVar95._16_4_ = auVar106._16_4_ * 0.0;
        auVar95._20_4_ = auVar106._20_4_ * 0.0;
        auVar95._24_4_ = auVar106._24_4_ * 0.0;
        auVar95._28_4_ = iVar2;
        auVar85 = vfmsub231ps_fma(auVar95,auVar99,auVar94);
        auVar96._4_4_ = fVar130 * auVar94._4_4_;
        auVar96._0_4_ = fVar82 * auVar94._0_4_;
        auVar96._8_4_ = fVar132 * auVar94._8_4_;
        auVar96._12_4_ = fVar135 * auVar94._12_4_;
        auVar96._16_4_ = auVar94._16_4_ * 0.0;
        auVar96._20_4_ = auVar94._20_4_ * 0.0;
        auVar96._24_4_ = auVar94._24_4_ * 0.0;
        auVar96._28_4_ = auVar107._28_4_;
        auVar141 = vfmsub231ps_fma(auVar96,auVar93,auVar108);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar141),auVar98,ZEXT1632(auVar85));
        auVar179._0_4_ = auVar108._0_4_ * auVar99._0_4_;
        auVar179._4_4_ = auVar108._4_4_ * auVar99._4_4_;
        auVar179._8_4_ = auVar108._8_4_ * auVar99._8_4_;
        auVar179._12_4_ = auVar108._12_4_ * auVar99._12_4_;
        auVar179._16_4_ = auVar108._16_4_ * fVar160;
        auVar179._20_4_ = auVar108._20_4_ * fVar176;
        auVar179._24_4_ = auVar108._24_4_ * fVar183;
        auVar179._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar179,auVar104,auVar106);
        auVar95 = vfmadd231ps_avx512vl(auVar107,auVar98,ZEXT1632(auVar85));
        auVar107 = vmulps_avx512vl(auVar92,auVar111);
        auVar107 = vfmsub231ps_avx512vl(auVar107,auVar105,auVar113);
        auVar97._4_4_ = auVar91._4_4_ * auVar113._4_4_;
        auVar97._0_4_ = auVar91._0_4_ * auVar113._0_4_;
        auVar97._8_4_ = auVar91._8_4_ * auVar113._8_4_;
        auVar97._12_4_ = auVar91._12_4_ * auVar113._12_4_;
        auVar97._16_4_ = auVar91._16_4_ * auVar113._16_4_;
        auVar97._20_4_ = auVar91._20_4_ * auVar113._20_4_;
        auVar97._24_4_ = auVar91._24_4_ * auVar113._24_4_;
        auVar97._28_4_ = auVar113._28_4_;
        auVar85 = vfmsub231ps_fma(auVar97,auVar112,auVar92);
        auVar180._0_4_ = auVar112._0_4_ * auVar105._0_4_;
        auVar180._4_4_ = auVar112._4_4_ * auVar105._4_4_;
        auVar180._8_4_ = auVar112._8_4_ * auVar105._8_4_;
        auVar180._12_4_ = auVar112._12_4_ * auVar105._12_4_;
        auVar180._16_4_ = fVar184 * auVar105._16_4_;
        auVar180._20_4_ = fVar185 * auVar105._20_4_;
        auVar180._24_4_ = fVar175 * auVar105._24_4_;
        auVar180._28_4_ = 0;
        auVar141 = vfmsub231ps_fma(auVar180,auVar91,auVar111);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar141),auVar98,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar107,auVar98,ZEXT1632(auVar85));
        auVar107 = vmaxps_avx(auVar95,auVar96);
        uVar150 = vcmpps_avx512vl(auVar107,auVar98,2);
        bVar80 = bVar80 & (byte)uVar150;
        in_ZMM20 = ZEXT3264(local_440);
        in_ZMM21 = ZEXT3264(local_460);
        auVar213 = ZEXT3264(local_3c0);
        if (bVar80 == 0) {
          bVar80 = 0;
          auVar196 = ZEXT3264(local_580);
          auVar174 = ZEXT3264(local_5e0);
        }
        else {
          auVar37._4_4_ = auVar92._4_4_ * auVar108._4_4_;
          auVar37._0_4_ = auVar92._0_4_ * auVar108._0_4_;
          auVar37._8_4_ = auVar92._8_4_ * auVar108._8_4_;
          auVar37._12_4_ = auVar92._12_4_ * auVar108._12_4_;
          auVar37._16_4_ = auVar92._16_4_ * auVar108._16_4_;
          auVar37._20_4_ = auVar92._20_4_ * auVar108._20_4_;
          auVar37._24_4_ = auVar92._24_4_ * auVar108._24_4_;
          auVar37._28_4_ = auVar107._28_4_;
          auVar88 = vfmsub231ps_fma(auVar37,auVar91,auVar106);
          auVar38._4_4_ = auVar106._4_4_ * auVar105._4_4_;
          auVar38._0_4_ = auVar106._0_4_ * auVar105._0_4_;
          auVar38._8_4_ = auVar106._8_4_ * auVar105._8_4_;
          auVar38._12_4_ = auVar106._12_4_ * auVar105._12_4_;
          auVar38._16_4_ = auVar106._16_4_ * auVar105._16_4_;
          auVar38._20_4_ = auVar106._20_4_ * auVar105._20_4_;
          auVar38._24_4_ = auVar106._24_4_ * auVar105._24_4_;
          auVar38._28_4_ = auVar106._28_4_;
          auVar141 = vfmsub231ps_fma(auVar38,auVar94,auVar92);
          auVar39._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar39._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar39._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar39._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar39._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar39._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar39._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar39._28_4_ = auVar91._28_4_;
          auVar20 = vfmsub231ps_fma(auVar39,auVar105,auVar108);
          auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar141),ZEXT1632(auVar20));
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar88),auVar98);
          auVar108 = vrcp14ps_avx512vl(auVar107);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar106 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar28);
          auVar85 = vfmadd132ps_fma(auVar106,auVar108,auVar108);
          auVar40._4_4_ = auVar20._4_4_ * auVar99._4_4_;
          auVar40._0_4_ = auVar20._0_4_ * auVar99._0_4_;
          auVar40._8_4_ = auVar20._8_4_ * auVar99._8_4_;
          auVar40._12_4_ = auVar20._12_4_ * auVar99._12_4_;
          auVar40._16_4_ = fVar160 * 0.0;
          auVar40._20_4_ = fVar176 * 0.0;
          auVar40._24_4_ = fVar183 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar141 = vfmadd231ps_fma(auVar40,auVar104,ZEXT1632(auVar141));
          auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar93,ZEXT1632(auVar88));
          fVar176 = auVar85._0_4_;
          fVar183 = auVar85._4_4_;
          fVar184 = auVar85._8_4_;
          fVar185 = auVar85._12_4_;
          auVar108 = ZEXT1632(CONCAT412(auVar141._12_4_ * fVar185,
                                        CONCAT48(auVar141._8_4_ * fVar184,
                                                 CONCAT44(auVar141._4_4_ * fVar183,
                                                          auVar141._0_4_ * fVar176))));
          auVar199._4_4_ = uVar74;
          auVar199._0_4_ = uVar74;
          auVar199._8_4_ = uVar74;
          auVar199._12_4_ = uVar74;
          auVar199._16_4_ = uVar74;
          auVar199._20_4_ = uVar74;
          auVar199._24_4_ = uVar74;
          auVar199._28_4_ = uVar74;
          uVar150 = vcmpps_avx512vl(auVar199,auVar108,2);
          fVar160 = (ray->super_RayK<1>).tfar;
          auVar29._4_4_ = fVar160;
          auVar29._0_4_ = fVar160;
          auVar29._8_4_ = fVar160;
          auVar29._12_4_ = fVar160;
          auVar29._16_4_ = fVar160;
          auVar29._20_4_ = fVar160;
          auVar29._24_4_ = fVar160;
          auVar29._28_4_ = fVar160;
          uVar24 = vcmpps_avx512vl(auVar108,auVar29,2);
          bVar80 = (byte)uVar150 & (byte)uVar24 & bVar80;
          if (bVar80 == 0) {
            bVar80 = 0;
            auVar196 = ZEXT3264(local_580);
            auVar174 = ZEXT3264(local_5e0);
          }
          else {
            uVar150 = vcmpps_avx512vl(auVar107,auVar98,4);
            if ((bVar80 & (byte)uVar150) == 0) {
              bVar80 = 0;
              auVar196 = ZEXT3264(local_580);
              auVar174 = ZEXT3264(local_5e0);
            }
            else {
              bVar80 = bVar80 & (byte)uVar150;
              fVar160 = auVar95._0_4_ * fVar176;
              fVar175 = auVar95._4_4_ * fVar183;
              auVar41._4_4_ = fVar175;
              auVar41._0_4_ = fVar160;
              fVar81 = auVar95._8_4_ * fVar184;
              auVar41._8_4_ = fVar81;
              fVar82 = auVar95._12_4_ * fVar185;
              auVar41._12_4_ = fVar82;
              fVar129 = auVar95._16_4_ * 0.0;
              auVar41._16_4_ = fVar129;
              fVar130 = auVar95._20_4_ * 0.0;
              auVar41._20_4_ = fVar130;
              fVar131 = auVar95._24_4_ * 0.0;
              auVar41._24_4_ = fVar131;
              auVar41._28_4_ = auVar95._28_4_;
              fVar176 = auVar96._0_4_ * fVar176;
              fVar183 = auVar96._4_4_ * fVar183;
              auVar42._4_4_ = fVar183;
              auVar42._0_4_ = fVar176;
              fVar184 = auVar96._8_4_ * fVar184;
              auVar42._8_4_ = fVar184;
              fVar185 = auVar96._12_4_ * fVar185;
              auVar42._12_4_ = fVar185;
              fVar132 = auVar96._16_4_ * 0.0;
              auVar42._16_4_ = fVar132;
              fVar134 = auVar96._20_4_ * 0.0;
              auVar42._20_4_ = fVar134;
              fVar135 = auVar96._24_4_ * 0.0;
              auVar42._24_4_ = fVar135;
              auVar42._28_4_ = auVar96._28_4_;
              auVar191._8_4_ = 0x3f800000;
              auVar191._0_8_ = &DAT_3f8000003f800000;
              auVar191._12_4_ = 0x3f800000;
              auVar191._16_4_ = 0x3f800000;
              auVar191._20_4_ = 0x3f800000;
              auVar191._24_4_ = 0x3f800000;
              auVar191._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar191,auVar41);
              bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
              bVar19 = SUB81(uVar72 >> 7,0);
              auVar196 = ZEXT3264(CONCAT428((uint)bVar19 * auVar95._28_4_ |
                                            (uint)!bVar19 * auVar107._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar131 |
                                                      (uint)!bVar18 * auVar107._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar130 |
                                                                (uint)!bVar17 * auVar107._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar129 |
                                                                          (uint)!bVar16 *
                                                                          auVar107._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar82 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar107._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar81 |
                                                  (uint)!bVar14 * auVar107._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar175 |
                                                           (uint)!bVar13 * auVar107._4_4_,
                                                           (uint)(bVar71 & 1) * (int)fVar160 |
                                                           (uint)!(bool)(bVar71 & 1) *
                                                           auVar107._0_4_))))))));
              auVar107 = vsubps_avx(auVar191,auVar42);
              bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
              bVar19 = SUB81(uVar72 >> 7,0);
              local_220._4_4_ = (uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar107._4_4_;
              local_220._0_4_ =
                   (uint)(bVar71 & 1) * (int)fVar176 | (uint)!(bool)(bVar71 & 1) * auVar107._0_4_;
              local_220._8_4_ = (uint)bVar14 * (int)fVar184 | (uint)!bVar14 * auVar107._8_4_;
              local_220._12_4_ = (uint)bVar15 * (int)fVar185 | (uint)!bVar15 * auVar107._12_4_;
              local_220._16_4_ = (uint)bVar16 * (int)fVar132 | (uint)!bVar16 * auVar107._16_4_;
              local_220._20_4_ = (uint)bVar17 * (int)fVar134 | (uint)!bVar17 * auVar107._20_4_;
              local_220._24_4_ = (uint)bVar18 * (int)fVar135 | (uint)!bVar18 * auVar107._24_4_;
              local_220._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar107._28_4_;
              auVar174 = ZEXT3264(auVar108);
            }
          }
        }
        auVar217 = ZEXT3264(local_4a0);
        auVar216 = ZEXT3264(local_480);
        auVar203 = ZEXT1664(local_600);
        if (bVar80 != 0) {
          auVar107 = vsubps_avx(ZEXT1632(auVar142),auVar101);
          local_360 = auVar196._0_32_;
          auVar85 = vfmadd213ps_fma(auVar107,local_360,auVar101);
          fVar160 = pre->depth_scale;
          auVar101._4_4_ = fVar160;
          auVar101._0_4_ = fVar160;
          auVar101._8_4_ = fVar160;
          auVar101._12_4_ = fVar160;
          auVar101._16_4_ = fVar160;
          auVar101._20_4_ = fVar160;
          auVar101._24_4_ = fVar160;
          auVar101._28_4_ = fVar160;
          auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                        CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                 CONCAT44(auVar85._4_4_ +
                                                                          auVar85._4_4_,
                                                                          auVar85._0_4_ +
                                                                          auVar85._0_4_)))),auVar101
                                    );
          local_320 = auVar174._0_32_;
          uVar150 = vcmpps_avx512vl(local_320,auVar107,6);
          bVar80 = bVar80 & (byte)uVar150;
          if (bVar80 != 0) {
            auVar143._8_4_ = 0xbf800000;
            auVar143._0_8_ = 0xbf800000bf800000;
            auVar143._12_4_ = 0xbf800000;
            auVar143._16_4_ = 0xbf800000;
            auVar143._20_4_ = 0xbf800000;
            auVar143._24_4_ = 0xbf800000;
            auVar143._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_220 = vfmadd132ps_avx512vl(local_220,auVar143,auVar30);
            auVar107 = local_220;
            local_340 = local_220;
            local_300 = 0;
            local_2fc = iVar10;
            local_2f0 = local_600;
            local_2e0 = local_550;
            uStack_2d8 = uStack_548;
            local_2d0 = local_560;
            uStack_2c8 = uStack_558;
            local_2b0 = bVar80;
            local_220 = auVar107;
            if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar160 = 1.0 / (float)local_380._0_4_;
              local_2a0[0] = fVar160 * (auVar196._0_4_ + 0.0);
              local_2a0[1] = fVar160 * (auVar196._4_4_ + 1.0);
              local_2a0[2] = fVar160 * (auVar196._8_4_ + 2.0);
              local_2a0[3] = fVar160 * (auVar196._12_4_ + 3.0);
              fStack_290 = fVar160 * (auVar196._16_4_ + 4.0);
              fStack_28c = fVar160 * (auVar196._20_4_ + 5.0);
              fStack_288 = fVar160 * (auVar196._24_4_ + 6.0);
              fStack_284 = auVar196._28_4_ + 7.0;
              local_280 = local_220._0_8_;
              uStack_278 = local_220._8_8_;
              uStack_270 = local_220._16_8_;
              uStack_268 = local_220._24_8_;
              local_260 = local_320;
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar108 = vblendmps_avx512vl(auVar144,local_320);
              auVar116._0_4_ =
                   (uint)(bVar80 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 1 & 1);
              auVar116._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 2 & 1);
              auVar116._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 3 & 1);
              auVar116._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 4 & 1);
              auVar116._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 5 & 1);
              auVar116._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar80 >> 6 & 1);
              auVar116._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar116._28_4_ =
                   (uint)(bVar80 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
              auVar108 = vshufps_avx(auVar116,auVar116,0xb1);
              auVar108 = vminps_avx(auVar116,auVar108);
              auVar106 = vshufpd_avx(auVar108,auVar108,5);
              auVar108 = vminps_avx(auVar108,auVar106);
              auVar106 = vpermpd_avx2(auVar108,0x4e);
              auVar108 = vminps_avx(auVar108,auVar106);
              uVar150 = vcmpps_avx512vl(auVar116,auVar108,0);
              bVar70 = (byte)uVar150 & bVar80;
              bVar71 = bVar80;
              if (bVar70 != 0) {
                bVar71 = bVar70;
              }
              uVar25 = 0;
              for (uVar73 = (uint)bVar71; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                uVar25 = uVar25 + 1;
              }
              uVar72 = (ulong)uVar25;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar160 = local_2a0[uVar72];
                fVar176 = *(float *)((long)&local_280 + uVar72 * 4);
                fVar183 = 1.0 - fVar160;
                auVar88 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar183 + fVar183))),
                                           ZEXT416((uint)fVar183),ZEXT416((uint)fVar183));
                auVar141 = ZEXT416((uint)fVar160);
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar141,
                                          ZEXT416(0xc0a00000));
                auVar142 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                           ZEXT416((uint)(fVar160 + fVar160)),auVar85);
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar141,
                                          ZEXT416(0x40000000));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * -3.0)),
                                          ZEXT416((uint)(fVar183 + fVar183)),auVar85);
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),auVar141,
                                           ZEXT416((uint)(fVar183 * -2.0)));
                fVar183 = auVar88._0_4_ * 0.5;
                fVar184 = auVar142._0_4_ * 0.5;
                fVar185 = auVar85._0_4_ * 0.5;
                auVar196 = ZEXT3264(local_360);
                fVar175 = auVar141._0_4_ * 0.5;
                auVar165._0_4_ = fVar175 * local_540;
                auVar165._4_4_ = fVar175 * fStack_53c;
                auVar165._8_4_ = fVar175 * fStack_538;
                auVar165._12_4_ = fVar175 * fStack_534;
                auVar187._4_4_ = fVar185;
                auVar187._0_4_ = fVar185;
                auVar187._8_4_ = fVar185;
                auVar187._12_4_ = fVar185;
                auVar85 = vfmadd132ps_fma(auVar187,auVar165,*pauVar4);
                auVar166._4_4_ = fVar184;
                auVar166._0_4_ = fVar184;
                auVar166._8_4_ = fVar184;
                auVar166._12_4_ = fVar184;
                auVar85 = vfmadd132ps_fma(auVar166,auVar85,*pauVar3);
                auVar156._4_4_ = fVar183;
                auVar156._0_4_ = fVar183;
                auVar156._8_4_ = fVar183;
                auVar156._12_4_ = fVar183;
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar72 * 4);
                auVar85 = vfmadd213ps_fma(auVar156,local_600,auVar85);
                auVar174 = ZEXT3264(local_320);
                uVar150 = vmovlps_avx(auVar85);
                *(undefined8 *)&(ray->Ng).field_0 = uVar150;
                fVar183 = (float)vextractps_avx(auVar85,2);
                (ray->Ng).field_0.field_0.z = fVar183;
                ray->u = fVar160;
                ray->v = fVar176;
                ray->primID = uVar75;
                ray->geomID = uVar78;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_410 = (float)local_550;
                uStack_40c = (undefined4)((ulong)local_550 >> 0x20);
                uStack_408 = uStack_548;
                local_4b0 = (Geometry *)local_560;
                uStack_4a8 = uStack_558;
                local_610 = prim;
                local_618 = context;
                local_620 = pre;
                local_580 = local_360;
                local_5e0 = local_320;
                local_420 = local_540;
                fStack_41c = fStack_53c;
                fStack_418 = fStack_538;
                fStack_414 = fStack_534;
                do {
                  auVar88 = auVar214._0_16_;
                  local_524 = local_2a0[uVar72];
                  local_520 = *(undefined4 *)((long)&local_280 + uVar72 * 4);
                  fVar160 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar72 * 4);
                  local_5b0.context = context->user;
                  fVar176 = 1.0 - local_524;
                  auVar141 = vfnmadd231ss_fma(ZEXT416((uint)(local_524 * (fVar176 + fVar176))),
                                              ZEXT416((uint)fVar176),ZEXT416((uint)fVar176));
                  auVar142 = ZEXT416((uint)local_524);
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                            ZEXT416(0xc0a00000));
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524 * 3.0)),
                                            ZEXT416((uint)(local_524 + local_524)),auVar87);
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                            ZEXT416(0x40000000));
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar176 * fVar176 * -3.0)),
                                            ZEXT416((uint)(fVar176 + fVar176)),auVar87);
                  auVar142 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524)),auVar142,
                                             ZEXT416((uint)(fVar176 * -2.0)));
                  fVar176 = auVar141._0_4_ * 0.5;
                  fVar183 = auVar85._0_4_ * 0.5;
                  fVar184 = auVar87._0_4_ * 0.5;
                  fVar185 = auVar142._0_4_ * 0.5;
                  auVar171._0_4_ = fVar185 * local_420;
                  auVar171._4_4_ = fVar185 * fStack_41c;
                  auVar171._8_4_ = fVar185 * fStack_418;
                  auVar171._12_4_ = fVar185 * fStack_414;
                  auVar190._4_4_ = fVar184;
                  auVar190._0_4_ = fVar184;
                  auVar190._8_4_ = fVar184;
                  auVar190._12_4_ = fVar184;
                  auVar65._8_8_ = uStack_4a8;
                  auVar65._0_8_ = local_4b0;
                  auVar87 = vfmadd132ps_fma(auVar190,auVar171,auVar65);
                  auVar172._4_4_ = fVar183;
                  auVar172._0_4_ = fVar183;
                  auVar172._8_4_ = fVar183;
                  auVar172._12_4_ = fVar183;
                  auVar67._4_4_ = uStack_40c;
                  auVar67._0_4_ = local_410;
                  auVar67._8_8_ = uStack_408;
                  auVar87 = vfmadd132ps_fma(auVar172,auVar87,auVar67);
                  auVar159._4_4_ = fVar176;
                  auVar159._0_4_ = fVar176;
                  auVar159._8_4_ = fVar176;
                  auVar159._12_4_ = fVar176;
                  auVar87 = vfmadd213ps_fma(auVar159,auVar203._0_16_,auVar87);
                  local_530 = vmovlps_avx(auVar87);
                  local_528 = vextractps_avx(auVar87,2);
                  local_51c = (int)local_5e8;
                  local_518 = (int)local_608;
                  local_514 = (local_5b0.context)->instID[0];
                  local_510 = (local_5b0.context)->instPrimID[0];
                  local_624 = -1;
                  local_5b0.valid = &local_624;
                  local_5b0.geometryUserPtr = pGVar11->userPtr;
                  local_5b0.ray = (RTCRayN *)ray;
                  local_5b0.hit = (RTCHitN *)&local_530;
                  local_5b0.N = 1;
                  local_3a0 = (uint)uVar72;
                  uStack_39c = (uint)(uVar72 >> 0x20);
                  if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b5fb7c:
                    auVar87 = auVar214._0_16_;
                    p_Var12 = context->args->filter;
                    if (p_Var12 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_5b0);
                        uVar72 = CONCAT44(uStack_39c,local_3a0);
                        auVar215 = ZEXT1664(local_3e0._0_16_);
                        auVar217 = ZEXT3264(local_4a0);
                        auVar216 = ZEXT3264(local_480);
                        auVar212 = ZEXT3264(local_500);
                        auVar211 = ZEXT3264(local_4e0);
                        auVar213 = ZEXT3264(local_3c0);
                        auVar203 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar87 = vxorps_avx512vl(auVar87,auVar87);
                        auVar214 = ZEXT1664(auVar87);
                        prim = local_610;
                        context = local_618;
                        pre = local_620;
                        uVar74 = local_400._0_4_;
                      }
                      if (*local_5b0.valid == 0) goto LAB_01b5fc88;
                    }
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5b0.hit;
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5b0.hit + 4);
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5b0.hit + 8);
                    *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                    *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                    *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                    *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                    *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                    *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                  }
                  else {
                    (*pGVar11->intersectionFilterN)(&local_5b0);
                    uVar72 = CONCAT44(uStack_39c,local_3a0);
                    auVar215 = ZEXT1664(local_3e0._0_16_);
                    auVar217 = ZEXT3264(local_4a0);
                    auVar216 = ZEXT3264(local_480);
                    auVar212 = ZEXT3264(local_500);
                    auVar211 = ZEXT3264(local_4e0);
                    auVar213 = ZEXT3264(local_3c0);
                    auVar203 = ZEXT1664(local_600);
                    in_ZMM21 = ZEXT3264(local_460);
                    in_ZMM20 = ZEXT3264(local_440);
                    auVar87 = vxorps_avx512vl(auVar88,auVar88);
                    auVar214 = ZEXT1664(auVar87);
                    prim = local_610;
                    context = local_618;
                    pre = local_620;
                    uVar74 = local_400._0_4_;
                    if (*local_5b0.valid != 0) goto LAB_01b5fb7c;
LAB_01b5fc88:
                    (ray->super_RayK<1>).tfar = fVar160;
                  }
                  auVar87 = auVar215._0_16_;
                  auVar174 = ZEXT3264(local_5e0);
                  bVar71 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & bVar80;
                  fVar160 = (ray->super_RayK<1>).tfar;
                  auVar36._4_4_ = fVar160;
                  auVar36._0_4_ = fVar160;
                  auVar36._8_4_ = fVar160;
                  auVar36._12_4_ = fVar160;
                  auVar36._16_4_ = fVar160;
                  auVar36._20_4_ = fVar160;
                  auVar36._24_4_ = fVar160;
                  auVar36._28_4_ = fVar160;
                  uVar150 = vcmpps_avx512vl(local_5e0,auVar36,2);
                  bVar80 = bVar71 & (byte)uVar150;
                  auVar196 = ZEXT3264(local_580);
                  if ((bVar71 & (byte)uVar150) != 0) {
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar107 = vblendmps_avx512vl(auVar149,local_5e0);
                    auVar128._0_4_ =
                         (uint)(bVar80 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 1 & 1);
                    auVar128._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 2 & 1);
                    auVar128._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 3 & 1);
                    auVar128._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 4 & 1);
                    auVar128._16_4_ = (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 5 & 1);
                    auVar128._20_4_ = (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar80 >> 6 & 1);
                    auVar128._24_4_ = (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar128._28_4_ =
                         (uint)(bVar80 >> 7) * auVar107._28_4_ |
                         (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                    auVar107 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar107 = vminps_avx(auVar128,auVar107);
                    auVar108 = vshufpd_avx(auVar107,auVar107,5);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    auVar108 = vpermpd_avx2(auVar107,0x4e);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    uVar150 = vcmpps_avx512vl(auVar128,auVar107,0);
                    bVar70 = (byte)uVar150 & bVar80;
                    bVar71 = bVar80;
                    if (bVar70 != 0) {
                      bVar71 = bVar70;
                    }
                    uVar78 = 0;
                    for (uVar75 = (uint)bVar71; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000
                        ) {
                      uVar78 = uVar78 + 1;
                    }
                    uVar72 = (ulong)uVar78;
                  }
                } while (bVar80 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_3e0 = vpbroadcastd_avx512vl();
        local_400 = vbroadcastss_avx512vl(auVar87);
        local_3a0 = uVar74;
        uStack_39c = uVar74;
        uStack_398 = uVar74;
        uStack_394 = uVar74;
        uStack_390 = uVar74;
        uStack_38c = uVar74;
        uStack_388 = uVar74;
        uStack_384 = uVar74;
        local_380._4_4_ = 1.0 / (float)local_380._0_4_;
        local_380._0_4_ = local_380._4_4_;
        fStack_378 = (float)local_380._4_4_;
        fStack_374 = (float)local_380._4_4_;
        fStack_370 = (float)local_380._4_4_;
        fStack_36c = (float)local_380._4_4_;
        fStack_368 = (float)local_380._4_4_;
        fStack_364 = (float)local_380._4_4_;
        lVar76 = 8;
        local_580 = auVar196._0_32_;
        local_5e0 = auVar174._0_32_;
        do {
          auVar107 = vpbroadcastd_avx512vl();
          auVar91 = vpor_avx2(auVar107,_DAT_0205a920);
          uVar24 = vpcmpd_avx512vl(auVar91,local_3e0,1);
          auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar76 * 4 + lVar26);
          auVar108 = *(undefined1 (*) [32])(lVar26 + 0x22307f0 + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x2230c74 + lVar76 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar26 + 0x22310f8 + lVar76 * 4);
          local_480 = auVar216._0_32_;
          auVar92 = vmulps_avx512vl(local_480,auVar105);
          local_4a0 = auVar217._0_32_;
          auVar93 = vmulps_avx512vl(local_4a0,auVar105);
          auVar43._4_4_ = auVar105._4_4_ * (float)local_120._4_4_;
          auVar43._0_4_ = auVar105._0_4_ * (float)local_120._0_4_;
          auVar43._8_4_ = auVar105._8_4_ * fStack_118;
          auVar43._12_4_ = auVar105._12_4_ * fStack_114;
          auVar43._16_4_ = auVar105._16_4_ * fStack_110;
          auVar43._20_4_ = auVar105._20_4_ * fStack_10c;
          auVar43._24_4_ = auVar105._24_4_ * fStack_108;
          auVar43._28_4_ = auVar91._28_4_;
          auVar91 = vfmadd231ps_avx512vl(auVar92,auVar106,local_c0);
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar106,local_e0);
          auVar93 = vfmadd231ps_avx512vl(auVar43,auVar106,local_100);
          auVar109 = auVar212._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar109);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar108,local_1c0);
          auVar87 = vfmadd231ps_fma(auVar93,auVar108,local_a0);
          auVar110 = auVar213._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar91,auVar107,auVar110);
          auVar103 = auVar211._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar107,auVar103);
          auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar76 * 4 + lVar26);
          auVar92 = *(undefined1 (*) [32])(lVar26 + 0x2232c10 + lVar76 * 4);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar107,local_80);
          auVar93 = *(undefined1 (*) [32])(lVar26 + 0x2233094 + lVar76 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar26 + 0x2233518 + lVar76 * 4);
          auVar94 = vmulps_avx512vl(local_480,auVar104);
          auVar95 = vmulps_avx512vl(local_4a0,auVar104);
          auVar44._4_4_ = auVar104._4_4_ * (float)local_120._4_4_;
          auVar44._0_4_ = auVar104._0_4_ * (float)local_120._0_4_;
          auVar44._8_4_ = auVar104._8_4_ * fStack_118;
          auVar44._12_4_ = auVar104._12_4_ * fStack_114;
          auVar44._16_4_ = auVar104._16_4_ * fStack_110;
          auVar44._20_4_ = auVar104._20_4_ * fStack_10c;
          auVar44._24_4_ = auVar104._24_4_ * fStack_108;
          auVar44._28_4_ = uStack_104;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_c0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_e0);
          auVar98 = vfmadd231ps_avx512vl(auVar44,auVar93,local_100);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar109);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_1c0);
          auVar85 = vfmadd231ps_fma(auVar98,auVar92,local_a0);
          auVar98 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar110);
          auVar99 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar103);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar91,local_80);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar85));
          auVar94 = vsubps_avx(auVar98,auVar96);
          auVar95 = vsubps_avx(auVar99,auVar97);
          auVar101 = vmulps_avx512vl(auVar97,auVar94);
          auVar102 = vmulps_avx512vl(auVar96,auVar95);
          auVar101 = vsubps_avx512vl(auVar101,auVar102);
          auVar102 = vmulps_avx512vl(auVar95,auVar95);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,auVar94);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar102);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar150 = vcmpps_avx512vl(auVar101,auVar100,2);
          local_2b0 = (byte)uVar24 & (byte)uVar150;
          if (local_2b0 == 0) {
            auVar196 = ZEXT3264(local_580);
            auVar174 = ZEXT3264(local_5e0);
            auVar211 = ZEXT3264(auVar103);
            auVar212 = ZEXT3264(auVar109);
          }
          else {
            auVar104 = vmulps_avx512vl(local_1a0,auVar104);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_180,auVar104);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
            auVar105 = vmulps_avx512vl(local_1a0,auVar105);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar105);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar106);
            auVar92 = vfmadd213ps_avx512vl(auVar107,local_140,auVar108);
            auVar107 = *(undefined1 (*) [32])(lVar26 + 0x223157c + lVar76 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2231a00 + lVar76 * 4);
            auVar106 = *(undefined1 (*) [32])(lVar26 + 0x2231e84 + lVar76 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar26 + 0x2232308 + lVar76 * 4);
            auVar93 = vmulps_avx512vl(local_480,auVar105);
            auVar104 = vmulps_avx512vl(local_4a0,auVar105);
            auVar105 = vmulps_avx512vl(local_1a0,auVar105);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_c0);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_e0);
            auVar106 = vfmadd231ps_avx512vl(auVar105,local_180,auVar106);
            auVar105 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar109);
            auVar93 = vfmadd231ps_avx512vl(auVar104,auVar108,local_1c0);
            auVar108 = vfmadd231ps_avx512vl(auVar106,local_160,auVar108);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar110);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,auVar103);
            auVar104 = vfmadd231ps_avx512vl(auVar108,local_140,auVar107);
            auVar107 = *(undefined1 (*) [32])(lVar26 + 0x223399c + lVar76 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x22342a4 + lVar76 * 4);
            auVar106 = *(undefined1 (*) [32])(lVar26 + 0x2234728 + lVar76 * 4);
            auVar100 = vmulps_avx512vl(local_480,auVar106);
            auVar101 = vmulps_avx512vl(local_4a0,auVar106);
            auVar106 = vmulps_avx512vl(local_1a0,auVar106);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_c0);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_e0);
            auVar106 = vfmadd231ps_avx512vl(auVar106,local_180,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2233e20 + lVar76 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar109);
            auVar142 = vfmadd231ps_fma(auVar101,auVar108,local_1c0);
            auVar108 = vfmadd231ps_avx512vl(auVar106,local_160,auVar108);
            auVar106 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar110);
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar142),auVar107,auVar103);
            auVar108 = vfmadd231ps_avx512vl(auVar108,local_140,auVar107);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar105,auVar101);
            vandps_avx512vl(auVar93,auVar101);
            auVar107 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar104,auVar101);
            auVar107 = vmaxps_avx(auVar107,auVar101);
            uVar72 = vcmpps_avx512vl(auVar107,local_400,1);
            bVar13 = (bool)((byte)uVar72 & 1);
            auVar117._0_4_ = (float)((uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar105._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar105._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar105._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar105._12_4_);
            bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar105._16_4_);
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar105._20_4_);
            bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar105._24_4_);
            bVar13 = SUB81(uVar72 >> 7,0);
            auVar117._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar105._28_4_;
            bVar13 = (bool)((byte)uVar72 & 1);
            auVar118._0_4_ = (float)((uint)bVar13 * auVar95._0_4_ | (uint)!bVar13 * auVar93._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar93._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar93._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar93._12_4_);
            bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar13 * auVar95._16_4_ | (uint)!bVar13 * auVar93._16_4_);
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar13 * auVar95._20_4_ | (uint)!bVar13 * auVar93._20_4_);
            bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar13 * auVar95._24_4_ | (uint)!bVar13 * auVar93._24_4_);
            bVar13 = SUB81(uVar72 >> 7,0);
            auVar118._28_4_ = (uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar93._28_4_;
            vandps_avx512vl(auVar106,auVar101);
            vandps_avx512vl(auVar100,auVar101);
            auVar107 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar108,auVar101);
            auVar107 = vmaxps_avx(auVar107,auVar118);
            uVar72 = vcmpps_avx512vl(auVar107,local_400,1);
            bVar13 = (bool)((byte)uVar72 & 1);
            auVar119._0_4_ = (uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar106._0_4_;
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar106._4_4_;
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar106._8_4_;
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar106._12_4_;
            bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar106._16_4_;
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar106._20_4_;
            bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar106._24_4_;
            bVar13 = SUB81(uVar72 >> 7,0);
            auVar119._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar106._28_4_;
            bVar13 = (bool)((byte)uVar72 & 1);
            auVar120._0_4_ = (float)((uint)bVar13 * auVar95._0_4_ | (uint)!bVar13 * auVar100._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar100._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar100._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar100._12_4_);
            bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar13 * auVar95._16_4_ | (uint)!bVar13 * auVar100._16_4_);
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar13 * auVar95._20_4_ | (uint)!bVar13 * auVar100._20_4_);
            bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar13 * auVar95._24_4_ | (uint)!bVar13 * auVar100._24_4_);
            bVar13 = SUB81(uVar72 >> 7,0);
            auVar120._28_4_ = (uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar100._28_4_;
            auVar202._8_4_ = 0x80000000;
            auVar202._0_8_ = 0x8000000080000000;
            auVar202._12_4_ = 0x80000000;
            auVar202._16_4_ = 0x80000000;
            auVar202._20_4_ = 0x80000000;
            auVar202._24_4_ = 0x80000000;
            auVar202._28_4_ = 0x80000000;
            auVar107 = vxorps_avx512vl(auVar119,auVar202);
            auVar100 = auVar214._0_32_;
            auVar108 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar100);
            auVar142 = vfmadd231ps_fma(auVar108,auVar118,auVar118);
            auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar142));
            auVar210._8_4_ = 0xbf000000;
            auVar210._0_8_ = 0xbf000000bf000000;
            auVar210._12_4_ = 0xbf000000;
            auVar210._16_4_ = 0xbf000000;
            auVar210._20_4_ = 0xbf000000;
            auVar210._24_4_ = 0xbf000000;
            auVar210._28_4_ = 0xbf000000;
            fVar160 = auVar108._0_4_;
            fVar176 = auVar108._4_4_;
            fVar183 = auVar108._8_4_;
            fVar184 = auVar108._12_4_;
            fVar185 = auVar108._16_4_;
            fVar175 = auVar108._20_4_;
            fVar81 = auVar108._24_4_;
            auVar45._4_4_ = fVar176 * fVar176 * fVar176 * auVar142._4_4_ * -0.5;
            auVar45._0_4_ = fVar160 * fVar160 * fVar160 * auVar142._0_4_ * -0.5;
            auVar45._8_4_ = fVar183 * fVar183 * fVar183 * auVar142._8_4_ * -0.5;
            auVar45._12_4_ = fVar184 * fVar184 * fVar184 * auVar142._12_4_ * -0.5;
            auVar45._16_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar45._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar45._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
            auVar45._28_4_ = auVar118._28_4_;
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar108 = vfmadd231ps_avx512vl(auVar45,auVar106,auVar108);
            auVar46._4_4_ = auVar118._4_4_ * auVar108._4_4_;
            auVar46._0_4_ = auVar118._0_4_ * auVar108._0_4_;
            auVar46._8_4_ = auVar118._8_4_ * auVar108._8_4_;
            auVar46._12_4_ = auVar118._12_4_ * auVar108._12_4_;
            auVar46._16_4_ = auVar118._16_4_ * auVar108._16_4_;
            auVar46._20_4_ = auVar118._20_4_ * auVar108._20_4_;
            auVar46._24_4_ = auVar118._24_4_ * auVar108._24_4_;
            auVar46._28_4_ = 0;
            auVar47._4_4_ = auVar108._4_4_ * -auVar117._4_4_;
            auVar47._0_4_ = auVar108._0_4_ * -auVar117._0_4_;
            auVar47._8_4_ = auVar108._8_4_ * -auVar117._8_4_;
            auVar47._12_4_ = auVar108._12_4_ * -auVar117._12_4_;
            auVar47._16_4_ = auVar108._16_4_ * -auVar117._16_4_;
            auVar47._20_4_ = auVar108._20_4_ * -auVar117._20_4_;
            auVar47._24_4_ = auVar108._24_4_ * -auVar117._24_4_;
            auVar47._28_4_ = auVar118._28_4_;
            auVar105 = vmulps_avx512vl(auVar108,auVar100);
            auVar108 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar100);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,auVar120);
            auVar93 = vrsqrt14ps_avx512vl(auVar108);
            auVar108 = vmulps_avx512vl(auVar108,auVar210);
            fVar160 = auVar93._0_4_;
            fVar176 = auVar93._4_4_;
            fVar183 = auVar93._8_4_;
            fVar184 = auVar93._12_4_;
            fVar185 = auVar93._16_4_;
            fVar175 = auVar93._20_4_;
            fVar81 = auVar93._24_4_;
            auVar48._4_4_ = fVar176 * fVar176 * fVar176 * auVar108._4_4_;
            auVar48._0_4_ = fVar160 * fVar160 * fVar160 * auVar108._0_4_;
            auVar48._8_4_ = fVar183 * fVar183 * fVar183 * auVar108._8_4_;
            auVar48._12_4_ = fVar184 * fVar184 * fVar184 * auVar108._12_4_;
            auVar48._16_4_ = fVar185 * fVar185 * fVar185 * auVar108._16_4_;
            auVar48._20_4_ = fVar175 * fVar175 * fVar175 * auVar108._20_4_;
            auVar48._24_4_ = fVar81 * fVar81 * fVar81 * auVar108._24_4_;
            auVar48._28_4_ = auVar108._28_4_;
            auVar108 = vfmadd231ps_avx512vl(auVar48,auVar106,auVar93);
            auVar49._4_4_ = auVar120._4_4_ * auVar108._4_4_;
            auVar49._0_4_ = auVar120._0_4_ * auVar108._0_4_;
            auVar49._8_4_ = auVar120._8_4_ * auVar108._8_4_;
            auVar49._12_4_ = auVar120._12_4_ * auVar108._12_4_;
            auVar49._16_4_ = auVar120._16_4_ * auVar108._16_4_;
            auVar49._20_4_ = auVar120._20_4_ * auVar108._20_4_;
            auVar49._24_4_ = auVar120._24_4_ * auVar108._24_4_;
            auVar49._28_4_ = auVar93._28_4_;
            auVar50._4_4_ = auVar108._4_4_ * auVar107._4_4_;
            auVar50._0_4_ = auVar108._0_4_ * auVar107._0_4_;
            auVar50._8_4_ = auVar108._8_4_ * auVar107._8_4_;
            auVar50._12_4_ = auVar108._12_4_ * auVar107._12_4_;
            auVar50._16_4_ = auVar108._16_4_ * auVar107._16_4_;
            auVar50._20_4_ = auVar108._20_4_ * auVar107._20_4_;
            auVar50._24_4_ = auVar108._24_4_ * auVar107._24_4_;
            auVar50._28_4_ = auVar107._28_4_;
            auVar107 = vmulps_avx512vl(auVar108,auVar100);
            auVar142 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar87),auVar96);
            auVar108 = ZEXT1632(auVar87);
            auVar141 = vfmadd213ps_fma(auVar47,auVar108,auVar97);
            auVar106 = vfmadd213ps_avx512vl(auVar105,auVar108,auVar92);
            auVar93 = vfmadd213ps_avx512vl(auVar49,ZEXT1632(auVar85),auVar98);
            auVar89 = vfnmadd213ps_fma(auVar46,auVar108,auVar96);
            auVar104 = ZEXT1632(auVar85);
            auVar88 = vfmadd213ps_fma(auVar50,auVar104,auVar99);
            auVar23 = vfnmadd213ps_fma(auVar47,auVar108,auVar97);
            auVar20 = vfmadd213ps_fma(auVar107,auVar104,auVar91);
            auVar97 = ZEXT1632(auVar87);
            auVar83 = vfnmadd231ps_fma(auVar92,auVar97,auVar105);
            auVar86 = vfnmadd213ps_fma(auVar49,auVar104,auVar98);
            auVar84 = vfnmadd213ps_fma(auVar50,auVar104,auVar99);
            auVar90 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar85),auVar107);
            auVar91 = vsubps_avx512vl(auVar93,ZEXT1632(auVar89));
            auVar107 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar23));
            auVar108 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar83));
            auVar51._4_4_ = auVar107._4_4_ * auVar83._4_4_;
            auVar51._0_4_ = auVar107._0_4_ * auVar83._0_4_;
            auVar51._8_4_ = auVar107._8_4_ * auVar83._8_4_;
            auVar51._12_4_ = auVar107._12_4_ * auVar83._12_4_;
            auVar51._16_4_ = auVar107._16_4_ * 0.0;
            auVar51._20_4_ = auVar107._20_4_ * 0.0;
            auVar51._24_4_ = auVar107._24_4_ * 0.0;
            auVar51._28_4_ = auVar105._28_4_;
            auVar87 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar23),auVar108);
            auVar52._4_4_ = auVar108._4_4_ * auVar89._4_4_;
            auVar52._0_4_ = auVar108._0_4_ * auVar89._0_4_;
            auVar52._8_4_ = auVar108._8_4_ * auVar89._8_4_;
            auVar52._12_4_ = auVar108._12_4_ * auVar89._12_4_;
            auVar52._16_4_ = auVar108._16_4_ * 0.0;
            auVar52._20_4_ = auVar108._20_4_ * 0.0;
            auVar52._24_4_ = auVar108._24_4_ * 0.0;
            auVar52._28_4_ = auVar108._28_4_;
            auVar21 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar83),auVar91);
            auVar53._4_4_ = auVar23._4_4_ * auVar91._4_4_;
            auVar53._0_4_ = auVar23._0_4_ * auVar91._0_4_;
            auVar53._8_4_ = auVar23._8_4_ * auVar91._8_4_;
            auVar53._12_4_ = auVar23._12_4_ * auVar91._12_4_;
            auVar53._16_4_ = auVar91._16_4_ * 0.0;
            auVar53._20_4_ = auVar91._20_4_ * 0.0;
            auVar53._24_4_ = auVar91._24_4_ * 0.0;
            auVar53._28_4_ = auVar91._28_4_;
            auVar22 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar89),auVar107);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar100,ZEXT1632(auVar21));
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,ZEXT1632(auVar87));
            uVar72 = vcmpps_avx512vl(auVar107,auVar100,2);
            bVar80 = (byte)uVar72;
            fVar130 = (float)((uint)(bVar80 & 1) * auVar142._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar86._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar132 = (float)((uint)bVar13 * auVar142._4_4_ | (uint)!bVar13 * auVar86._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar135 = (float)((uint)bVar13 * auVar142._8_4_ | (uint)!bVar13 * auVar86._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar136 = (float)((uint)bVar13 * auVar142._12_4_ | (uint)!bVar13 * auVar86._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar132,fVar130))));
            fVar131 = (float)((uint)(bVar80 & 1) * auVar141._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar84._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar134 = (float)((uint)bVar13 * auVar141._4_4_ | (uint)!bVar13 * auVar84._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar133 = (float)((uint)bVar13 * auVar141._8_4_ | (uint)!bVar13 * auVar84._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar137 = (float)((uint)bVar13 * auVar141._12_4_ | (uint)!bVar13 * auVar84._12_4_);
            auVar94 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar133,CONCAT44(fVar134,fVar131))));
            auVar121._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar90._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar90._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar90._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar90._12_4_);
            fVar160 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar106._16_4_);
            auVar121._16_4_ = fVar160;
            fVar176 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar106._20_4_);
            auVar121._20_4_ = fVar176;
            fVar183 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar106._24_4_);
            auVar121._24_4_ = fVar183;
            iVar1 = (uint)(byte)(uVar72 >> 7) * auVar106._28_4_;
            auVar121._28_4_ = iVar1;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar93);
            auVar122._0_4_ =
                 (uint)(bVar80 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar87._0_4_;
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar87._4_4_;
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar87._8_4_;
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar87._12_4_;
            auVar122._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_;
            auVar122._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_;
            auVar122._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_;
            auVar122._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar23),ZEXT1632(auVar88));
            auVar123._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar107._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar142._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar142._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar142._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar142._12_4_);
            fVar185 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
            auVar123._16_4_ = fVar185;
            fVar175 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
            auVar123._20_4_ = fVar175;
            fVar184 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
            auVar123._24_4_ = fVar184;
            auVar123._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
            auVar107 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar20));
            auVar124._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar107._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar141._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar141._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar141._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar141._12_4_);
            fVar129 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
            auVar124._16_4_ = fVar129;
            fVar82 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
            auVar124._20_4_ = fVar82;
            fVar81 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
            auVar124._24_4_ = fVar81;
            iVar2 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
            auVar124._28_4_ = iVar2;
            auVar125._0_4_ =
                 (uint)(bVar80 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar93._0_4_
            ;
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar13 * (int)auVar89._4_4_ | (uint)!bVar13 * auVar93._4_4_;
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar13 * (int)auVar89._8_4_ | (uint)!bVar13 * auVar93._8_4_;
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar13 * (int)auVar89._12_4_ | (uint)!bVar13 * auVar93._12_4_;
            auVar125._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_;
            auVar125._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_;
            auVar125._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_;
            auVar125._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar93._28_4_;
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar93 = vsubps_avx512vl(auVar125,auVar104);
            auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar23._12_4_ |
                                                     (uint)!bVar17 * auVar88._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar23._8_4_ |
                                                              (uint)!bVar15 * auVar88._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar23._4_4_ |
                                                                       (uint)!bVar13 * auVar88._4_4_
                                                                       ,(uint)(bVar80 & 1) *
                                                                        (int)auVar23._0_4_ |
                                                                        (uint)!(bool)(bVar80 & 1) *
                                                                        auVar88._0_4_)))),auVar94);
            auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar83._12_4_ |
                                                     (uint)!bVar18 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar83._8_4_ |
                                                              (uint)!bVar16 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar83._4_4_ |
                                                                       (uint)!bVar14 * auVar20._4_4_
                                                                       ,(uint)(bVar80 & 1) *
                                                                        (int)auVar83._0_4_ |
                                                                        (uint)!(bool)(bVar80 & 1) *
                                                                        auVar20._0_4_)))),auVar121);
            auVar105 = vsubps_avx(auVar104,auVar122);
            auVar91 = vsubps_avx(auVar94,auVar123);
            auVar92 = vsubps_avx(auVar121,auVar124);
            auVar54._4_4_ = auVar106._4_4_ * fVar132;
            auVar54._0_4_ = auVar106._0_4_ * fVar130;
            auVar54._8_4_ = auVar106._8_4_ * fVar135;
            auVar54._12_4_ = auVar106._12_4_ * fVar136;
            auVar54._16_4_ = auVar106._16_4_ * 0.0;
            auVar54._20_4_ = auVar106._20_4_ * 0.0;
            auVar54._24_4_ = auVar106._24_4_ * 0.0;
            auVar54._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar54,auVar121,auVar93);
            auVar173._0_4_ = fVar131 * auVar93._0_4_;
            auVar173._4_4_ = fVar134 * auVar93._4_4_;
            auVar173._8_4_ = fVar133 * auVar93._8_4_;
            auVar173._12_4_ = fVar137 * auVar93._12_4_;
            auVar173._16_4_ = auVar93._16_4_ * 0.0;
            auVar173._20_4_ = auVar93._20_4_ * 0.0;
            auVar173._24_4_ = auVar93._24_4_ * 0.0;
            auVar173._28_4_ = 0;
            auVar142 = vfmsub231ps_fma(auVar173,auVar104,auVar108);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar142),auVar100,ZEXT1632(auVar87));
            auVar181._0_4_ = auVar108._0_4_ * auVar121._0_4_;
            auVar181._4_4_ = auVar108._4_4_ * auVar121._4_4_;
            auVar181._8_4_ = auVar108._8_4_ * auVar121._8_4_;
            auVar181._12_4_ = auVar108._12_4_ * auVar121._12_4_;
            auVar181._16_4_ = auVar108._16_4_ * fVar160;
            auVar181._20_4_ = auVar108._20_4_ * fVar176;
            auVar181._24_4_ = auVar108._24_4_ * fVar183;
            auVar181._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar181,auVar94,auVar106);
            auVar95 = vfmadd231ps_avx512vl(auVar107,auVar100,ZEXT1632(auVar87));
            auVar107 = vmulps_avx512vl(auVar92,auVar122);
            auVar107 = vfmsub231ps_avx512vl(auVar107,auVar105,auVar124);
            auVar55._4_4_ = auVar91._4_4_ * auVar124._4_4_;
            auVar55._0_4_ = auVar91._0_4_ * auVar124._0_4_;
            auVar55._8_4_ = auVar91._8_4_ * auVar124._8_4_;
            auVar55._12_4_ = auVar91._12_4_ * auVar124._12_4_;
            auVar55._16_4_ = auVar91._16_4_ * fVar129;
            auVar55._20_4_ = auVar91._20_4_ * fVar82;
            auVar55._24_4_ = auVar91._24_4_ * fVar81;
            auVar55._28_4_ = iVar2;
            auVar87 = vfmsub231ps_fma(auVar55,auVar123,auVar92);
            auVar182._0_4_ = auVar123._0_4_ * auVar105._0_4_;
            auVar182._4_4_ = auVar123._4_4_ * auVar105._4_4_;
            auVar182._8_4_ = auVar123._8_4_ * auVar105._8_4_;
            auVar182._12_4_ = auVar123._12_4_ * auVar105._12_4_;
            auVar182._16_4_ = fVar185 * auVar105._16_4_;
            auVar182._20_4_ = fVar175 * auVar105._20_4_;
            auVar182._24_4_ = fVar184 * auVar105._24_4_;
            auVar182._28_4_ = 0;
            auVar142 = vfmsub231ps_fma(auVar182,auVar91,auVar122);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar142),auVar100,auVar107);
            auVar96 = vfmadd231ps_avx512vl(auVar107,auVar100,ZEXT1632(auVar87));
            auVar107 = vmaxps_avx(auVar95,auVar96);
            uVar150 = vcmpps_avx512vl(auVar107,auVar100,2);
            local_2b0 = local_2b0 & (byte)uVar150;
            if (local_2b0 == 0) {
LAB_01b5f40d:
              local_2b0 = 0;
            }
            else {
              auVar56._4_4_ = auVar92._4_4_ * auVar108._4_4_;
              auVar56._0_4_ = auVar92._0_4_ * auVar108._0_4_;
              auVar56._8_4_ = auVar92._8_4_ * auVar108._8_4_;
              auVar56._12_4_ = auVar92._12_4_ * auVar108._12_4_;
              auVar56._16_4_ = auVar92._16_4_ * auVar108._16_4_;
              auVar56._20_4_ = auVar92._20_4_ * auVar108._20_4_;
              auVar56._24_4_ = auVar92._24_4_ * auVar108._24_4_;
              auVar56._28_4_ = auVar107._28_4_;
              auVar141 = vfmsub231ps_fma(auVar56,auVar91,auVar106);
              auVar57._4_4_ = auVar106._4_4_ * auVar105._4_4_;
              auVar57._0_4_ = auVar106._0_4_ * auVar105._0_4_;
              auVar57._8_4_ = auVar106._8_4_ * auVar105._8_4_;
              auVar57._12_4_ = auVar106._12_4_ * auVar105._12_4_;
              auVar57._16_4_ = auVar106._16_4_ * auVar105._16_4_;
              auVar57._20_4_ = auVar106._20_4_ * auVar105._20_4_;
              auVar57._24_4_ = auVar106._24_4_ * auVar105._24_4_;
              auVar57._28_4_ = auVar106._28_4_;
              auVar142 = vfmsub231ps_fma(auVar57,auVar93,auVar92);
              auVar58._4_4_ = auVar91._4_4_ * auVar93._4_4_;
              auVar58._0_4_ = auVar91._0_4_ * auVar93._0_4_;
              auVar58._8_4_ = auVar91._8_4_ * auVar93._8_4_;
              auVar58._12_4_ = auVar91._12_4_ * auVar93._12_4_;
              auVar58._16_4_ = auVar91._16_4_ * auVar93._16_4_;
              auVar58._20_4_ = auVar91._20_4_ * auVar93._20_4_;
              auVar58._24_4_ = auVar91._24_4_ * auVar93._24_4_;
              auVar58._28_4_ = auVar91._28_4_;
              auVar88 = vfmsub231ps_fma(auVar58,auVar105,auVar108);
              auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar142),ZEXT1632(auVar88));
              auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar141),auVar100);
              auVar108 = vrcp14ps_avx512vl(auVar107);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar106 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar31);
              auVar87 = vfmadd132ps_fma(auVar106,auVar108,auVar108);
              auVar59._4_4_ = auVar88._4_4_ * auVar121._4_4_;
              auVar59._0_4_ = auVar88._0_4_ * auVar121._0_4_;
              auVar59._8_4_ = auVar88._8_4_ * auVar121._8_4_;
              auVar59._12_4_ = auVar88._12_4_ * auVar121._12_4_;
              auVar59._16_4_ = fVar160 * 0.0;
              auVar59._20_4_ = fVar176 * 0.0;
              auVar59._24_4_ = fVar183 * 0.0;
              auVar59._28_4_ = iVar1;
              auVar142 = vfmadd231ps_fma(auVar59,auVar94,ZEXT1632(auVar142));
              auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar104,ZEXT1632(auVar141));
              fVar176 = auVar87._0_4_;
              fVar183 = auVar87._4_4_;
              fVar184 = auVar87._8_4_;
              fVar185 = auVar87._12_4_;
              auVar108 = ZEXT1632(CONCAT412(auVar142._12_4_ * fVar185,
                                            CONCAT48(auVar142._8_4_ * fVar184,
                                                     CONCAT44(auVar142._4_4_ * fVar183,
                                                              auVar142._0_4_ * fVar176))));
              auVar68._4_4_ = uStack_39c;
              auVar68._0_4_ = local_3a0;
              auVar68._8_4_ = uStack_398;
              auVar68._12_4_ = uStack_394;
              auVar68._16_4_ = uStack_390;
              auVar68._20_4_ = uStack_38c;
              auVar68._24_4_ = uStack_388;
              auVar68._28_4_ = uStack_384;
              uVar150 = vcmpps_avx512vl(auVar108,auVar68,0xd);
              fVar160 = (ray->super_RayK<1>).tfar;
              auVar32._4_4_ = fVar160;
              auVar32._0_4_ = fVar160;
              auVar32._8_4_ = fVar160;
              auVar32._12_4_ = fVar160;
              auVar32._16_4_ = fVar160;
              auVar32._20_4_ = fVar160;
              auVar32._24_4_ = fVar160;
              auVar32._28_4_ = fVar160;
              uVar24 = vcmpps_avx512vl(auVar108,auVar32,2);
              local_2b0 = (byte)uVar150 & (byte)uVar24 & local_2b0;
              if (local_2b0 == 0) goto LAB_01b5f40d;
              uVar150 = vcmpps_avx512vl(auVar107,auVar100,4);
              if ((local_2b0 & (byte)uVar150) == 0) {
                local_2b0 = 0;
              }
              else {
                local_2b0 = local_2b0 & (byte)uVar150;
                fVar160 = auVar95._0_4_ * fVar176;
                fVar175 = auVar95._4_4_ * fVar183;
                auVar60._4_4_ = fVar175;
                auVar60._0_4_ = fVar160;
                fVar81 = auVar95._8_4_ * fVar184;
                auVar60._8_4_ = fVar81;
                fVar82 = auVar95._12_4_ * fVar185;
                auVar60._12_4_ = fVar82;
                fVar129 = auVar95._16_4_ * 0.0;
                auVar60._16_4_ = fVar129;
                fVar130 = auVar95._20_4_ * 0.0;
                auVar60._20_4_ = fVar130;
                fVar131 = auVar95._24_4_ * 0.0;
                auVar60._24_4_ = fVar131;
                auVar60._28_4_ = auVar95._28_4_;
                fVar176 = auVar96._0_4_ * fVar176;
                fVar183 = auVar96._4_4_ * fVar183;
                auVar61._4_4_ = fVar183;
                auVar61._0_4_ = fVar176;
                fVar184 = auVar96._8_4_ * fVar184;
                auVar61._8_4_ = fVar184;
                fVar185 = auVar96._12_4_ * fVar185;
                auVar61._12_4_ = fVar185;
                fVar132 = auVar96._16_4_ * 0.0;
                auVar61._16_4_ = fVar132;
                fVar134 = auVar96._20_4_ * 0.0;
                auVar61._20_4_ = fVar134;
                fVar135 = auVar96._24_4_ * 0.0;
                auVar61._24_4_ = fVar135;
                auVar61._28_4_ = auVar96._28_4_;
                auVar192._8_4_ = 0x3f800000;
                auVar192._0_8_ = &DAT_3f8000003f800000;
                auVar192._12_4_ = 0x3f800000;
                auVar192._16_4_ = 0x3f800000;
                auVar192._20_4_ = 0x3f800000;
                auVar192._24_4_ = 0x3f800000;
                auVar192._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx512vl(auVar192,auVar60);
                bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                bVar19 = SUB81(uVar72 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar95._28_4_ |
                                              (uint)!bVar19 * auVar107._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar131 |
                                                        (uint)!bVar18 * auVar107._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar130 |
                                                                  (uint)!bVar17 * auVar107._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar129 |
                                                                            (uint)!bVar16 *
                                                                            auVar107._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar82 |
                                                                                      (uint)!bVar15
                                                                                      * auVar107.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar81 |
                                                                  (uint)!bVar14 * auVar107._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar175 |
                                                                           (uint)!bVar13 *
                                                                           auVar107._4_4_,
                                                                           (uint)(bVar80 & 1) *
                                                                           (int)fVar160 |
                                                                           (uint)!(bool)(bVar80 & 1)
                                                                           * auVar107._0_4_))))))));
                auVar107 = vsubps_avx(auVar192,auVar61);
                bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                bVar19 = SUB81(uVar72 >> 7,0);
                local_240._4_4_ = (uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar107._4_4_;
                local_240._0_4_ =
                     (uint)(bVar80 & 1) * (int)fVar176 | (uint)!(bool)(bVar80 & 1) * auVar107._0_4_;
                local_240._8_4_ = (uint)bVar14 * (int)fVar184 | (uint)!bVar14 * auVar107._8_4_;
                local_240._12_4_ = (uint)bVar15 * (int)fVar185 | (uint)!bVar15 * auVar107._12_4_;
                local_240._16_4_ = (uint)bVar16 * (int)fVar132 | (uint)!bVar16 * auVar107._16_4_;
                local_240._20_4_ = (uint)bVar17 * (int)fVar134 | (uint)!bVar17 * auVar107._20_4_;
                local_240._24_4_ = (uint)bVar18 * (int)fVar135 | (uint)!bVar18 * auVar107._24_4_;
                local_240._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar107._28_4_;
                in_ZMM21 = ZEXT3264(auVar108);
              }
            }
            auVar212 = ZEXT3264(local_500);
            auVar211 = ZEXT3264(local_4e0);
            auVar215 = ZEXT1664(local_600);
            auVar196 = ZEXT3264(local_580);
            auVar174 = ZEXT3264(local_5e0);
            if (local_2b0 != 0) {
              auVar107 = vsubps_avx(ZEXT1632(auVar85),auVar97);
              local_360 = in_ZMM20._0_32_;
              auVar107 = vfmadd213ps_avx512vl(auVar107,local_360,auVar97);
              auVar145._0_4_ = auVar107._0_4_ + auVar107._0_4_;
              auVar145._4_4_ = auVar107._4_4_ + auVar107._4_4_;
              auVar145._8_4_ = auVar107._8_4_ + auVar107._8_4_;
              auVar145._12_4_ = auVar107._12_4_ + auVar107._12_4_;
              auVar145._16_4_ = auVar107._16_4_ + auVar107._16_4_;
              auVar145._20_4_ = auVar107._20_4_ + auVar107._20_4_;
              auVar145._24_4_ = auVar107._24_4_ + auVar107._24_4_;
              auVar145._28_4_ = auVar107._28_4_ + auVar107._28_4_;
              fVar160 = pre->depth_scale;
              auVar33._4_4_ = fVar160;
              auVar33._0_4_ = fVar160;
              auVar33._8_4_ = fVar160;
              auVar33._12_4_ = fVar160;
              auVar33._16_4_ = fVar160;
              auVar33._20_4_ = fVar160;
              auVar33._24_4_ = fVar160;
              auVar33._28_4_ = fVar160;
              auVar107 = vmulps_avx512vl(auVar145,auVar33);
              local_320 = in_ZMM21._0_32_;
              uVar150 = vcmpps_avx512vl(local_320,auVar107,6);
              local_2b0 = local_2b0 & (byte)uVar150;
              uVar78 = (uint)local_2b0;
              if (local_2b0 != 0) {
                auVar146._8_4_ = 0xbf800000;
                auVar146._0_8_ = 0xbf800000bf800000;
                auVar146._12_4_ = 0xbf800000;
                auVar146._16_4_ = 0xbf800000;
                auVar146._20_4_ = 0xbf800000;
                auVar146._24_4_ = 0xbf800000;
                auVar146._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_240 = vfmadd132ps_avx512vl(local_240,auVar146,auVar34);
                auVar107 = local_240;
                local_340 = local_240;
                local_300 = (int)lVar76;
                local_2fc = iVar10;
                local_2f0 = local_600;
                local_2e0 = local_550;
                uStack_2d8 = uStack_548;
                local_2d0 = local_560;
                uStack_2c8 = uStack_558;
                local_2c0 = CONCAT44(fStack_53c,local_540);
                uStack_2b8 = CONCAT44(fStack_534,fStack_538);
                local_4b0 = (context->scene->geometries).items[local_608].ptr;
                local_240 = auVar107;
                if ((local_4b0->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar108 = vaddps_avx512vl(local_360,_DAT_02020f40);
                  auVar87 = vcvtsi2ss_avx512f(auVar213._0_16_,(int)lVar76);
                  fVar160 = auVar87._0_4_;
                  local_2a0[0] = (fVar160 + auVar108._0_4_) * (float)local_380._0_4_;
                  local_2a0[1] = (fVar160 + auVar108._4_4_) * (float)local_380._4_4_;
                  local_2a0[2] = (fVar160 + auVar108._8_4_) * fStack_378;
                  local_2a0[3] = (fVar160 + auVar108._12_4_) * fStack_374;
                  fStack_290 = (fVar160 + auVar108._16_4_) * fStack_370;
                  fStack_28c = (fVar160 + auVar108._20_4_) * fStack_36c;
                  fStack_288 = (fVar160 + auVar108._24_4_) * fStack_368;
                  fStack_284 = fVar160 + auVar108._28_4_;
                  local_280 = local_240._0_8_;
                  uStack_278 = local_240._8_8_;
                  uStack_270 = local_240._16_8_;
                  uStack_268 = local_240._24_8_;
                  local_260 = local_320;
                  auVar147._8_4_ = 0x7f800000;
                  auVar147._0_8_ = 0x7f8000007f800000;
                  auVar147._12_4_ = 0x7f800000;
                  auVar147._16_4_ = 0x7f800000;
                  auVar147._20_4_ = 0x7f800000;
                  auVar147._24_4_ = 0x7f800000;
                  auVar147._28_4_ = 0x7f800000;
                  auVar108 = vblendmps_avx512vl(auVar147,local_320);
                  auVar126._0_4_ =
                       (uint)(local_2b0 & 1) * auVar108._0_4_ |
                       (uint)!(bool)(local_2b0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 1 & 1);
                  auVar126._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 2 & 1);
                  auVar126._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 3 & 1);
                  auVar126._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 4 & 1);
                  auVar126._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 5 & 1);
                  auVar126._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2b0 >> 6 & 1);
                  auVar126._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar126._28_4_ =
                       (uint)(local_2b0 >> 7) * auVar108._28_4_ |
                       (uint)!(bool)(local_2b0 >> 7) * 0x7f800000;
                  auVar108 = vshufps_avx(auVar126,auVar126,0xb1);
                  auVar108 = vminps_avx(auVar126,auVar108);
                  auVar106 = vshufpd_avx(auVar108,auVar108,5);
                  auVar108 = vminps_avx(auVar108,auVar106);
                  auVar106 = vpermpd_avx2(auVar108,0x4e);
                  auVar108 = vminps_avx(auVar108,auVar106);
                  uVar150 = vcmpps_avx512vl(auVar126,auVar108,0);
                  bVar71 = (byte)uVar150 & local_2b0;
                  bVar80 = local_2b0;
                  if (bVar71 != 0) {
                    bVar80 = bVar71;
                  }
                  uVar75 = 0;
                  for (uVar74 = (uint)bVar80; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000)
                  {
                    uVar75 = uVar75 + 1;
                  }
                  uVar72 = (ulong)uVar75;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar160 = local_2a0[uVar72];
                    fVar176 = *(float *)((long)&local_280 + uVar72 * 4);
                    fVar183 = 1.0 - fVar160;
                    auVar141 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar183 + fVar183))),
                                                ZEXT416((uint)fVar183),ZEXT416((uint)fVar183));
                    auVar142 = ZEXT416((uint)fVar160);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                              ZEXT416(0xc0a00000));
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                              ZEXT416((uint)(fVar160 + fVar160)),auVar87);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                              ZEXT416(0x40000000));
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * -3.0)),
                                              ZEXT416((uint)(fVar183 + fVar183)),auVar87);
                    auVar142 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),auVar142,
                                               ZEXT416((uint)(fVar183 * -2.0)));
                    fVar183 = auVar141._0_4_ * 0.5;
                    fVar184 = auVar85._0_4_ * 0.5;
                    fVar185 = auVar87._0_4_ * 0.5;
                    fVar175 = auVar142._0_4_ * 0.5;
                    auVar167._0_4_ = fVar175 * local_540;
                    auVar167._4_4_ = fVar175 * fStack_53c;
                    auVar167._8_4_ = fVar175 * fStack_538;
                    auVar167._12_4_ = fVar175 * fStack_534;
                    auVar188._4_4_ = fVar185;
                    auVar188._0_4_ = fVar185;
                    auVar188._8_4_ = fVar185;
                    auVar188._12_4_ = fVar185;
                    auVar62._8_8_ = uStack_558;
                    auVar62._0_8_ = local_560;
                    auVar87 = vfmadd132ps_fma(auVar188,auVar167,auVar62);
                    auVar168._4_4_ = fVar184;
                    auVar168._0_4_ = fVar184;
                    auVar168._8_4_ = fVar184;
                    auVar168._12_4_ = fVar184;
                    auVar63._8_8_ = uStack_548;
                    auVar63._0_8_ = local_550;
                    auVar87 = vfmadd132ps_fma(auVar168,auVar87,auVar63);
                    auVar157._4_4_ = fVar183;
                    auVar157._0_4_ = fVar183;
                    auVar157._8_4_ = fVar183;
                    auVar157._12_4_ = fVar183;
                    (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar72 * 4);
                    auVar87 = vfmadd213ps_fma(auVar157,local_600,auVar87);
                    uVar150 = vmovlps_avx(auVar87);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar150;
                    fVar183 = (float)vextractps_avx(auVar87,2);
                    (ray->Ng).field_0.field_0.z = fVar183;
                    ray->u = fVar160;
                    ray->v = fVar176;
                    ray->primID = (uint)local_5e8;
                    ray->geomID = (uint)local_608;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    auVar196 = ZEXT3264(local_580);
                    auVar174 = ZEXT3264(local_5e0);
                  }
                  else {
                    local_420 = (float)local_550;
                    fStack_41c = (float)((ulong)local_550 >> 0x20);
                    fStack_418 = (float)uStack_548;
                    fStack_414 = (float)((ulong)uStack_548 >> 0x20);
                    local_1e0 = local_560;
                    uStack_1d8 = uStack_558;
                    local_1f0 = CONCAT44(fStack_53c,local_540);
                    uStack_1e8 = CONCAT44(fStack_534,fStack_538);
                    local_440 = local_360;
                    local_460 = local_320;
                    local_610 = prim;
                    local_618 = context;
                    local_620 = pre;
                    do {
                      auVar88 = auVar214._0_16_;
                      local_524 = local_2a0[uVar72];
                      local_520 = *(undefined4 *)((long)&local_280 + uVar72 * 4);
                      local_410 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar72 * 4);
                      local_5b0.context = context->user;
                      fVar160 = 1.0 - local_524;
                      auVar141 = vfnmadd231ss_fma(ZEXT416((uint)(local_524 * (fVar160 + fVar160))),
                                                  ZEXT416((uint)fVar160),ZEXT416((uint)fVar160));
                      auVar142 = ZEXT416((uint)local_524);
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                                ZEXT416(0xc0a00000));
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524 * 3.0)),
                                                ZEXT416((uint)(local_524 + local_524)),auVar87);
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                                ZEXT416(0x40000000));
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * -3.0)),
                                                ZEXT416((uint)(fVar160 + fVar160)),auVar87);
                      auVar142 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524)),auVar142,
                                                 ZEXT416((uint)(fVar160 * -2.0)));
                      fVar160 = auVar141._0_4_ * 0.5;
                      fVar176 = auVar85._0_4_ * 0.5;
                      fVar183 = auVar87._0_4_ * 0.5;
                      fVar184 = auVar142._0_4_ * 0.5;
                      auVar169._0_4_ = fVar184 * (float)local_1f0;
                      auVar169._4_4_ = fVar184 * local_1f0._4_4_;
                      auVar169._8_4_ = fVar184 * (float)uStack_1e8;
                      auVar169._12_4_ = fVar184 * uStack_1e8._4_4_;
                      auVar189._4_4_ = fVar183;
                      auVar189._0_4_ = fVar183;
                      auVar189._8_4_ = fVar183;
                      auVar189._12_4_ = fVar183;
                      auVar69._8_8_ = uStack_1d8;
                      auVar69._0_8_ = local_1e0;
                      auVar87 = vfmadd132ps_fma(auVar189,auVar169,auVar69);
                      auVar170._4_4_ = fVar176;
                      auVar170._0_4_ = fVar176;
                      auVar170._8_4_ = fVar176;
                      auVar170._12_4_ = fVar176;
                      auVar66._4_4_ = fStack_41c;
                      auVar66._0_4_ = local_420;
                      auVar66._8_4_ = fStack_418;
                      auVar66._12_4_ = fStack_414;
                      auVar87 = vfmadd132ps_fma(auVar170,auVar87,auVar66);
                      auVar158._4_4_ = fVar160;
                      auVar158._0_4_ = fVar160;
                      auVar158._8_4_ = fVar160;
                      auVar158._12_4_ = fVar160;
                      auVar87 = vfmadd213ps_fma(auVar158,auVar215._0_16_,auVar87);
                      local_530 = vmovlps_avx(auVar87);
                      local_528 = vextractps_avx(auVar87,2);
                      local_51c = (int)local_5e8;
                      local_518 = (int)local_608;
                      local_514 = (local_5b0.context)->instID[0];
                      local_510 = (local_5b0.context)->instPrimID[0];
                      local_624 = -1;
                      local_5b0.valid = &local_624;
                      local_5b0.geometryUserPtr = local_4b0->userPtr;
                      local_5b0.ray = (RTCRayN *)ray;
                      local_5b0.hit = (RTCHitN *)&local_530;
                      local_5b0.N = 1;
                      if (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b5f6d6:
                        auVar87 = auVar214._0_16_;
                        p_Var12 = context->args->filter;
                        if (p_Var12 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_4b0->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_5b0);
                            auVar217 = ZEXT3264(local_4a0);
                            auVar216 = ZEXT3264(local_480);
                            auVar212 = ZEXT3264(local_500);
                            auVar211 = ZEXT3264(local_4e0);
                            auVar213 = ZEXT3264(local_3c0);
                            auVar215 = ZEXT1664(local_600);
                            in_ZMM21 = ZEXT3264(local_460);
                            in_ZMM20 = ZEXT3264(local_440);
                            auVar87 = vxorps_avx512vl(auVar87,auVar87);
                            auVar214 = ZEXT1664(auVar87);
                            prim = local_610;
                            context = local_618;
                            pre = local_620;
                          }
                          if (*local_5b0.valid == 0) goto LAB_01b5f7d2;
                        }
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5b0.hit;
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5b0.hit + 4);
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5b0.hit + 8);
                        *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                        *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                        *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                        *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                        *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                        *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                      }
                      else {
                        (*local_4b0->intersectionFilterN)(&local_5b0);
                        auVar217 = ZEXT3264(local_4a0);
                        auVar216 = ZEXT3264(local_480);
                        auVar212 = ZEXT3264(local_500);
                        auVar211 = ZEXT3264(local_4e0);
                        auVar213 = ZEXT3264(local_3c0);
                        auVar215 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar87 = vxorps_avx512vl(auVar88,auVar88);
                        auVar214 = ZEXT1664(auVar87);
                        prim = local_610;
                        context = local_618;
                        pre = local_620;
                        if (*local_5b0.valid != 0) goto LAB_01b5f6d6;
LAB_01b5f7d2:
                        (ray->super_RayK<1>).tfar = local_410;
                      }
                      bVar71 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar78;
                      fVar160 = (ray->super_RayK<1>).tfar;
                      auVar35._4_4_ = fVar160;
                      auVar35._0_4_ = fVar160;
                      auVar35._8_4_ = fVar160;
                      auVar35._12_4_ = fVar160;
                      auVar35._16_4_ = fVar160;
                      auVar35._20_4_ = fVar160;
                      auVar35._24_4_ = fVar160;
                      auVar35._28_4_ = fVar160;
                      uVar150 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar35,2);
                      bVar80 = bVar71 & (byte)uVar150;
                      uVar78 = (uint)bVar80;
                      auVar196 = ZEXT3264(local_580);
                      auVar174 = ZEXT3264(local_5e0);
                      if ((bVar71 & (byte)uVar150) != 0) {
                        auVar148._8_4_ = 0x7f800000;
                        auVar148._0_8_ = 0x7f8000007f800000;
                        auVar148._12_4_ = 0x7f800000;
                        auVar148._16_4_ = 0x7f800000;
                        auVar148._20_4_ = 0x7f800000;
                        auVar148._24_4_ = 0x7f800000;
                        auVar148._28_4_ = 0x7f800000;
                        auVar107 = vblendmps_avx512vl(auVar148,in_ZMM21._0_32_);
                        auVar127._0_4_ =
                             (uint)(bVar80 & 1) * auVar107._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 1 & 1);
                        auVar127._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 2 & 1);
                        auVar127._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 3 & 1);
                        auVar127._12_4_ =
                             (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 4 & 1);
                        auVar127._16_4_ =
                             (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 5 & 1);
                        auVar127._20_4_ =
                             (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 6 & 1);
                        auVar127._24_4_ =
                             (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar127._28_4_ =
                             (uint)(bVar80 >> 7) * auVar107._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar107 = vshufps_avx(auVar127,auVar127,0xb1);
                        auVar107 = vminps_avx(auVar127,auVar107);
                        auVar108 = vshufpd_avx(auVar107,auVar107,5);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        auVar108 = vpermpd_avx2(auVar107,0x4e);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        uVar150 = vcmpps_avx512vl(auVar127,auVar107,0);
                        bVar71 = (byte)uVar150 & bVar80;
                        uVar75 = uVar78;
                        if (bVar71 != 0) {
                          uVar75 = (uint)bVar71;
                        }
                        uVar74 = 0;
                        for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                          uVar74 = uVar74 + 1;
                        }
                        uVar72 = (ulong)uVar74;
                      }
                    } while (bVar80 != 0);
                  }
                }
              }
            }
          }
          lVar76 = lVar76 + 8;
        } while ((int)lVar76 < iVar10);
      }
      fVar160 = (ray->super_RayK<1>).tfar;
      auVar27._4_4_ = fVar160;
      auVar27._0_4_ = fVar160;
      auVar27._8_4_ = fVar160;
      auVar27._12_4_ = fVar160;
      uVar150 = vcmpps_avx512vl(local_1d0,auVar27,2);
      uVar78 = (uint)uVar79 & (uint)uVar150;
      uVar79 = (ulong)uVar78;
    } while (uVar78 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }